

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic_pack8.h
# Opt level: O0

void ncnn::resize_bicubic_image_pack8
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 *puVar57;
  undefined8 *puVar58;
  undefined8 *puVar59;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  long in_R9;
  float fVar60;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar97;
  float fVar98;
  float fVar107;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar86;
  float fVar90;
  float fVar99;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar87;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  __m256 _D;
  __m256 _rows3_4;
  __m256 _rows2_3;
  __m256 _rows1_2;
  __m256 _rows0_1;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  __m256 _b3;
  __m256 _b2;
  __m256 _b1;
  __m256 _b0;
  __m256 _rows3_3;
  __m256 _rows2_2;
  __m256 _rows1_1;
  __m256 _rows0;
  __m256 _S33_3;
  __m256 _S32_3;
  __m256 _S31_3;
  __m256 _S30_3;
  __m256 _S23_2;
  __m256 _S22_2;
  __m256 _S21_2;
  __m256 _S20_2;
  __m256 _S13_1;
  __m256 _S12_1;
  __m256 _S11_1;
  __m256 _S10_1;
  __m256 _S03;
  __m256 _S02;
  __m256 _S01;
  __m256 _S00;
  __m256 _a3_3;
  __m256 _a2_3;
  __m256 _a1_3;
  __m256 _a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  __m256 _rows3_2;
  __m256 _rows2_1;
  __m256 _rows1;
  __m256 _S33_2;
  __m256 _S32_2;
  __m256 _S31_2;
  __m256 _S30_2;
  __m256 _S23_1;
  __m256 _S22_1;
  __m256 _S21_1;
  __m256 _S20_1;
  __m256 _S13;
  __m256 _S12;
  __m256 _S11;
  __m256 _S10;
  __m256 _a3_2;
  __m256 _a2_2;
  __m256 _a1_2;
  __m256 _a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  __m256 _rows3_1;
  __m256 _rows2;
  __m256 _S33_1;
  __m256 _S32_1;
  __m256 _S31_1;
  __m256 _S30_1;
  __m256 _S23;
  __m256 _S22;
  __m256 _S21;
  __m256 _S20;
  __m256 _a3_1;
  __m256 _a2_1;
  __m256 _a1_1;
  __m256 _a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  __m256 _rows3;
  __m256 _S33;
  __m256 _S32;
  __m256 _S31;
  __m256 _S30;
  __m256 _a3;
  __m256 _a2;
  __m256 _a1;
  __m256 _a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffc658;
  undefined8 in_stack_ffffffffffffc660;
  int _elempack;
  undefined8 **ppuVar108;
  size_t in_stack_ffffffffffffc668;
  undefined8 in_stack_ffffffffffffc670;
  int _w;
  Mat *in_stack_ffffffffffffc678;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  int local_2f8c;
  undefined8 *local_2f88;
  undefined8 *local_2f80;
  undefined8 *local_2f78;
  undefined8 *local_2f70;
  undefined8 *local_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 *local_2bd0;
  undefined8 *local_2bc8;
  undefined8 *local_2bc0;
  undefined8 *local_2bb8;
  int local_2bb0;
  int local_2bac;
  undefined8 *local_2ba8;
  undefined8 *local_2ba0;
  undefined8 *local_2b98;
  undefined8 *local_2b90;
  uint *local_2b88;
  long local_2b80;
  long local_2b78;
  long local_2b70;
  long local_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 *local_28f0;
  undefined8 *local_28e8;
  undefined8 *local_28e0;
  int local_28d8;
  int local_28d4;
  undefined8 *local_28d0;
  undefined8 *local_28c8;
  undefined8 *local_28c0;
  uint *local_28b8;
  long local_28b0;
  long local_28a8;
  long local_28a0;
  undefined8 *local_2898;
  undefined8 *local_2890;
  undefined8 *local_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 *local_26b0;
  undefined8 *local_26a8;
  int local_26a0;
  int local_269c;
  undefined8 *local_2698;
  undefined8 *local_2690;
  uint *local_2688;
  long local_2680;
  long local_2678;
  undefined8 *local_2670;
  undefined8 *local_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 *local_2538;
  int local_2530;
  int local_252c;
  undefined8 *local_2528;
  uint *local_2520;
  long local_2518;
  undefined8 *local_2510;
  int local_2504;
  int local_2500;
  int local_24fc;
  undefined8 *local_24f8;
  undefined8 *local_24f0;
  undefined8 *local_24e8;
  undefined8 *local_24e0;
  undefined8 *local_24d8;
  int *local_24d0;
  undefined8 local_24c8;
  undefined4 local_24c0;
  long *local_24b8;
  undefined4 local_24b0;
  undefined4 local_24ac;
  undefined4 local_24a8;
  undefined4 local_24a4;
  undefined4 local_24a0;
  undefined8 local_2498;
  undefined8 *local_2490;
  int *local_2488;
  undefined8 local_2480;
  undefined4 local_2478;
  long *local_2470;
  undefined4 local_2468;
  undefined4 local_2464;
  undefined4 local_2460;
  undefined4 local_245c;
  undefined4 local_2458;
  undefined8 local_2450;
  undefined8 *local_2438;
  int *local_2430;
  undefined8 local_2428;
  undefined4 local_2420;
  long *local_2418;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined4 local_2400;
  undefined8 local_23f8;
  undefined8 *local_23f0;
  int *local_23e8;
  undefined8 local_23e0;
  undefined4 local_23d8;
  long *local_23d0;
  undefined4 local_23c8;
  undefined4 local_23c4;
  undefined4 local_23c0;
  undefined4 local_23bc;
  undefined4 local_23b8;
  undefined8 local_23b0;
  int local_23a8;
  int local_23a4;
  long local_23a0;
  uint *local_2398;
  long local_2390;
  uint *local_2388;
  long *local_2380;
  long *local_2378;
  undefined8 *local_2370;
  undefined8 *local_2368;
  undefined8 *local_2360;
  undefined8 *local_2358;
  undefined8 *local_2350;
  undefined8 *local_2348;
  undefined8 *local_2340;
  undefined8 *local_2338;
  undefined8 *local_2330;
  undefined8 *local_2328;
  undefined8 *local_2320;
  undefined8 *local_2318;
  undefined8 *local_2310;
  undefined8 *local_2308;
  undefined8 *local_2300;
  undefined8 *local_22f8;
  undefined8 *local_22f0;
  undefined8 *local_22e8;
  undefined8 *local_22e0;
  undefined8 *local_22d8;
  undefined8 *local_22d0;
  undefined8 *local_22c8;
  undefined8 *local_22c0;
  undefined8 *local_22b8;
  undefined8 *local_22b0;
  undefined8 *local_22a8;
  undefined8 *local_22a0;
  undefined8 *local_2298;
  undefined8 *local_2290;
  undefined8 *local_2288;
  undefined8 *local_2280;
  undefined8 *local_2278;
  undefined8 *local_2270;
  undefined8 *local_2268;
  undefined8 *local_2260;
  undefined8 *local_2258;
  undefined8 *local_2250;
  undefined8 *local_2248;
  undefined8 *local_2240;
  undefined8 *local_2238;
  undefined8 *local_2230;
  undefined8 *local_2228;
  undefined8 *local_2220;
  undefined8 *local_2218;
  undefined8 **local_2210;
  undefined8 **local_2200;
  undefined8 **local_21f0;
  undefined8 **local_21e0;
  int local_21cc;
  long *local_21c8;
  int local_21bc;
  long *local_21b8;
  int local_21ac;
  long *local_21a8;
  int local_219c;
  long *local_2198;
  int local_218c;
  long *local_2188;
  int local_217c;
  long *local_2178;
  int local_216c;
  long *local_2168;
  int local_215c;
  long *local_2158;
  int local_214c;
  long *local_2148;
  int local_213c;
  long *local_2138;
  int local_212c;
  long *local_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 *local_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 *local_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 *local_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 *local_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 *local_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 *local_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 *local_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 *local_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 *local_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 *local_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 *local_1e78;
  uint local_1e70;
  uint local_1e6c;
  uint local_1e68;
  uint local_1e64;
  uint local_1e60;
  uint local_1e5c;
  uint local_1e58;
  uint local_1e54;
  uint local_1e50;
  uint local_1e4c;
  uint local_1e48;
  uint local_1e44;
  uint local_1e40;
  uint local_1e3c;
  uint local_1e38;
  uint local_1e34;
  uint local_1e30;
  uint local_1e2c;
  uint local_1e28;
  uint local_1e24;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  undefined8 *local_1af8;
  undefined8 *local_1af0;
  undefined8 *local_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  undefined8 *local_1a98;
  undefined8 *local_1a90;
  undefined8 *local_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined8 *local_1a38;
  undefined8 *local_1a30;
  undefined8 *local_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00;
  float fStack_19fc;
  float fStack_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined8 *local_19d8;
  undefined8 *local_19d0;
  undefined8 *local_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 *local_1978;
  undefined8 *local_1970;
  undefined8 *local_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float fStack_1928;
  float fStack_1924;
  undefined8 *local_1918;
  undefined8 *local_1910;
  undefined8 *local_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  undefined8 *local_18b8;
  undefined8 *local_18b0;
  undefined8 *local_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880;
  float fStack_187c;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  undefined8 *local_1858;
  undefined8 *local_1850;
  undefined8 *local_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 *local_17f8;
  undefined8 *local_17f0;
  undefined8 *local_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  undefined8 *local_1798;
  undefined8 *local_1790;
  undefined8 *local_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 *local_1738;
  undefined8 *local_1730;
  undefined8 *local_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined8 *local_16d8;
  undefined8 *local_16d0;
  undefined8 *local_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 *local_1678;
  undefined8 *local_1670;
  undefined8 *local_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined8 *local_1618;
  undefined8 *local_1610;
  undefined8 *local_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined8 *local_15b8;
  undefined8 *local_15b0;
  undefined8 *local_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  undefined8 *local_1558;
  undefined8 *local_1550;
  undefined8 *local_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined8 *local_14f8;
  undefined8 *local_14f0;
  undefined8 *local_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 *local_1498;
  undefined8 *local_1490;
  undefined8 *local_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 *local_1438;
  undefined8 *local_1430;
  undefined8 *local_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined8 *local_13d8;
  undefined8 *local_13d0;
  undefined8 *local_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined8 *local_1378;
  undefined8 *local_1370;
  undefined8 *local_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  undefined8 *local_1318;
  undefined8 *local_1310;
  undefined8 *local_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 *local_12b8;
  undefined8 *local_12b0;
  undefined8 *local_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined8 *local_1258;
  undefined8 *local_1250;
  undefined8 *local_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 *local_11f8;
  undefined8 *local_11f0;
  undefined8 *local_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 *local_1138;
  undefined8 *local_1130;
  undefined8 *local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 *local_10d8;
  undefined8 *local_10d0;
  undefined8 *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 *local_1078;
  undefined8 *local_1070;
  undefined8 *local_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 *local_1018;
  undefined8 *local_1010;
  undefined8 *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 *local_fb8;
  undefined8 *local_fb0;
  undefined8 *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 *local_f58;
  undefined8 *local_f50;
  undefined8 *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  int local_ef0;
  undefined4 local_eec;
  undefined8 **local_ee8;
  int local_ed0;
  undefined4 local_ecc;
  undefined8 **local_ec8;
  int local_eb0;
  undefined4 local_eac;
  undefined8 **local_ea8;
  int local_e90;
  undefined4 local_e8c;
  undefined8 **local_e88;
  undefined8 *local_e80;
  undefined8 *local_e70;
  undefined8 *local_e60;
  undefined8 *local_e50;
  undefined1 local_e40 [32];
  uint local_e20;
  uint local_e1c;
  uint local_e18;
  uint local_e14;
  uint local_e10;
  uint local_e0c;
  uint local_e08;
  uint local_e04;
  undefined1 local_e00 [32];
  uint local_de0;
  uint local_ddc;
  uint local_dd8;
  uint local_dd4;
  uint local_dd0;
  uint local_dcc;
  uint local_dc8;
  uint local_dc4;
  undefined1 local_dc0 [32];
  uint local_da0;
  uint local_d9c;
  uint local_d98;
  uint local_d94;
  uint local_d90;
  uint local_d8c;
  uint local_d88;
  uint local_d84;
  undefined1 local_d80 [32];
  uint local_d60;
  uint local_d5c;
  uint local_d58;
  uint local_d54;
  uint local_d50;
  uint local_d4c;
  uint local_d48;
  uint local_d44;
  undefined1 local_d40 [32];
  uint local_d20;
  uint local_d1c;
  uint local_d18;
  uint local_d14;
  uint local_d10;
  uint local_d0c;
  uint local_d08;
  uint local_d04;
  undefined1 local_d00 [32];
  uint local_ce0;
  uint local_cdc;
  uint local_cd8;
  uint local_cd4;
  uint local_cd0;
  uint local_ccc;
  uint local_cc8;
  uint local_cc4;
  undefined1 local_cc0 [32];
  uint local_ca0;
  uint local_c9c;
  uint local_c98;
  uint local_c94;
  uint local_c90;
  uint local_c8c;
  uint local_c88;
  uint local_c84;
  undefined1 local_c80 [32];
  uint local_c60;
  uint local_c5c;
  uint local_c58;
  uint local_c54;
  uint local_c50;
  uint local_c4c;
  uint local_c48;
  uint local_c44;
  undefined1 local_c40 [32];
  uint local_c20;
  uint local_c1c;
  uint local_c18;
  uint local_c14;
  uint local_c10;
  uint local_c0c;
  uint local_c08;
  uint local_c04;
  undefined1 local_c00 [32];
  uint local_be0;
  uint local_bdc;
  uint local_bd8;
  uint local_bd4;
  uint local_bd0;
  uint local_bcc;
  uint local_bc8;
  uint local_bc4;
  undefined1 local_bc0 [32];
  uint local_ba0;
  uint local_b9c;
  uint local_b98;
  uint local_b94;
  uint local_b90;
  uint local_b8c;
  uint local_b88;
  uint local_b84;
  undefined1 local_b80 [32];
  uint local_b60;
  uint local_b5c;
  uint local_b58;
  uint local_b54;
  uint local_b50;
  uint local_b4c;
  uint local_b48;
  uint local_b44;
  undefined1 local_b40 [32];
  uint local_b20;
  uint local_b1c;
  uint local_b18;
  uint local_b14;
  uint local_b10;
  uint local_b0c;
  uint local_b08;
  uint local_b04;
  undefined1 local_b00 [32];
  uint local_ae0;
  uint local_adc;
  uint local_ad8;
  uint local_ad4;
  uint local_ad0;
  uint local_acc;
  uint local_ac8;
  uint local_ac4;
  undefined1 local_ac0 [32];
  uint local_aa0;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uint local_a8c;
  uint local_a88;
  uint local_a84;
  undefined1 local_a80 [32];
  uint local_a60;
  uint local_a5c;
  uint local_a58;
  uint local_a54;
  uint local_a50;
  uint local_a4c;
  uint local_a48;
  uint local_a44;
  undefined1 local_a40 [32];
  uint local_a20;
  uint local_a1c;
  uint local_a18;
  uint local_a14;
  uint local_a10;
  uint local_a0c;
  uint local_a08;
  uint local_a04;
  undefined1 local_a00 [32];
  uint local_9e0;
  uint local_9dc;
  uint local_9d8;
  uint local_9d4;
  uint local_9d0;
  uint local_9cc;
  uint local_9c8;
  uint local_9c4;
  undefined1 local_9c0 [32];
  uint local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  uint local_98c;
  uint local_988;
  uint local_984;
  undefined1 local_980 [32];
  uint local_960;
  uint local_95c;
  uint local_958;
  uint local_954;
  uint local_950;
  uint local_94c;
  uint local_948;
  uint local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  int local_d4;
  undefined8 **local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  int local_ac;
  undefined8 **local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  undefined8 local_90;
  int local_84;
  undefined8 **local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  int local_5c;
  undefined8 **local_58;
  undefined8 **local_50;
  undefined8 **local_48;
  undefined8 **local_40;
  undefined8 **local_38;
  
  _w = (int)((ulong)in_stack_ffffffffffffc670 >> 0x20);
  _elempack = (int)((ulong)in_stack_ffffffffffffc660 >> 0x20);
  local_23a4 = *(int *)((long)in_RSI + 0x2c);
  local_23a8 = (int)in_RSI[6];
  local_d0 = &local_23f0;
  local_e0 = 0x20;
  local_e4 = 8;
  local_f0 = 0;
  local_23f0 = (undefined8 *)0x0;
  local_23e8 = (int *)0x0;
  local_23e0 = 0;
  local_23d8 = 0;
  local_23d0 = (long *)0x0;
  local_23c8 = 0;
  local_23c4 = 0;
  local_23c0 = 0;
  local_23bc = 0;
  local_23b8 = 0;
  local_23b0 = 0;
  local_23a0 = in_R9;
  local_2398 = in_R8;
  local_2390 = in_RCX;
  local_2388 = in_RDX;
  local_2380 = in_RSI;
  local_2378 = in_RDI;
  local_d4 = local_23a4;
  Mat::create(in_stack_ffffffffffffc678,_w,in_stack_ffffffffffffc668,_elempack,
              in_stack_ffffffffffffc658);
  local_a8 = &local_2438;
  local_ac = local_23a4;
  local_b8 = 0x20;
  local_bc = 8;
  local_c8 = 0;
  local_2438 = (undefined8 *)0x0;
  local_2430 = (int *)0x0;
  local_2428 = 0;
  local_2420 = 0;
  local_2418 = (long *)0x0;
  local_2410 = 0;
  local_240c = 0;
  local_2408 = 0;
  local_2404 = 0;
  local_2400 = 0;
  local_23f8 = 0;
  Mat::create(in_stack_ffffffffffffc678,_w,in_stack_ffffffffffffc668,_elempack,
              in_stack_ffffffffffffc658);
  local_80 = &local_2490;
  local_84 = local_23a4;
  local_90 = 0x20;
  local_94 = 8;
  local_a0 = 0;
  local_2490 = (undefined8 *)0x0;
  local_2488 = (int *)0x0;
  local_2480 = 0;
  local_2478 = 0;
  local_2470 = (long *)0x0;
  local_2468 = 0;
  local_2464 = 0;
  local_2460 = 0;
  local_245c = 0;
  local_2458 = 0;
  local_2450 = 0;
  Mat::create(in_stack_ffffffffffffc678,_w,in_stack_ffffffffffffc668,_elempack,
              in_stack_ffffffffffffc658);
  local_58 = &local_24d8;
  local_5c = local_23a4;
  local_68 = 0x20;
  local_6c = 8;
  local_78 = 0;
  local_24d8 = (undefined8 *)0x0;
  local_24d0 = (int *)0x0;
  local_24c8 = 0;
  local_24c0 = 0;
  local_24b8 = (long *)0x0;
  local_24b0 = 0;
  local_24ac = 0;
  local_24a8 = 0;
  local_24a4 = 0;
  local_24a0 = 0;
  local_2498 = 0;
  Mat::create(in_stack_ffffffffffffc678,_w,in_stack_ffffffffffffc668,_elempack,
              in_stack_ffffffffffffc658);
  local_38 = &local_23f0;
  local_24e0 = local_23f0;
  local_40 = &local_2438;
  local_24e8 = local_2438;
  local_48 = &local_2490;
  local_24f0 = local_2490;
  local_50 = &local_24d8;
  local_24f8 = local_24d8;
  local_24fc = -3;
  for (local_2500 = 0; puVar59 = local_24e0, puVar58 = local_24e8, puVar57 = local_24f0,
      local_2500 < local_23a8; local_2500 = local_2500 + 1) {
    local_2504 = *(int *)(local_23a0 + (long)local_2500 * 4);
    if (local_2504 != local_24fc) {
      if (local_2504 == local_24fc + 1) {
        local_2510 = local_24e0;
        local_24e0 = local_24e8;
        local_24e8 = local_24f0;
        local_24f0 = local_24f8;
        local_24f8 = puVar59;
        local_213c = local_2504 + 2;
        local_2138 = local_2378;
        local_2518 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_213c * local_2378[2];
        local_2520 = local_2388;
        local_2528 = puVar59;
        for (local_252c = 0; local_252c < local_23a4; local_252c = local_252c + 1) {
          local_2530 = *(int *)(local_2390 + (long)local_252c * 4) << 3;
          local_2538 = (undefined8 *)(local_2518 + (long)local_2530 * 4);
          local_1e24 = *local_2520;
          auVar1 = vinsertps_avx(ZEXT416(local_1e24),ZEXT416(local_1e24),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e24),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e24),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_1e24),ZEXT416(local_1e24),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e24),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e24),0x30);
          auVar61._16_16_ = auVar1;
          auVar61._0_16_ = auVar2;
          local_e40._0_8_ = auVar2._0_8_;
          local_e40._8_8_ = auVar2._8_8_;
          local_e40._16_8_ = auVar1._0_8_;
          local_e40._24_8_ = auVar1._8_8_;
          local_2560 = local_e40._0_8_;
          uStack_2558 = local_e40._8_8_;
          uStack_2550 = local_e40._16_8_;
          uStack_2548 = local_e40._24_8_;
          local_1e28 = local_2520[1];
          auVar3 = vinsertps_avx(ZEXT416(local_1e28),ZEXT416(local_1e28),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e28),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e28),0x30);
          auVar4 = vinsertps_avx(ZEXT416(local_1e28),ZEXT416(local_1e28),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e28),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e28),0x30);
          auVar62._16_16_ = auVar3;
          auVar62._0_16_ = auVar4;
          local_e00._0_8_ = auVar4._0_8_;
          local_e00._8_8_ = auVar4._8_8_;
          local_e00._16_8_ = auVar3._0_8_;
          local_e00._24_8_ = auVar3._8_8_;
          local_2580 = local_e00._0_8_;
          uStack_2578 = local_e00._8_8_;
          uStack_2570 = local_e00._16_8_;
          uStack_2568 = local_e00._24_8_;
          local_1e2c = local_2520[2];
          auVar5 = vinsertps_avx(ZEXT416(local_1e2c),ZEXT416(local_1e2c),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e2c),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e2c),0x30);
          auVar6 = vinsertps_avx(ZEXT416(local_1e2c),ZEXT416(local_1e2c),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e2c),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e2c),0x30);
          auVar63._16_16_ = auVar5;
          auVar63._0_16_ = auVar6;
          local_dc0._0_8_ = auVar6._0_8_;
          local_dc0._8_8_ = auVar6._8_8_;
          local_dc0._16_8_ = auVar5._0_8_;
          local_dc0._24_8_ = auVar5._8_8_;
          local_25a0 = local_dc0._0_8_;
          uStack_2598 = local_dc0._8_8_;
          uStack_2590 = local_dc0._16_8_;
          uStack_2588 = local_dc0._24_8_;
          local_1e30 = local_2520[3];
          auVar7 = vinsertps_avx(ZEXT416(local_1e30),ZEXT416(local_1e30),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e30),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e30),0x30);
          auVar8 = vinsertps_avx(ZEXT416(local_1e30),ZEXT416(local_1e30),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e30),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e30),0x30);
          auVar64._16_16_ = auVar7;
          auVar64._0_16_ = auVar8;
          local_d80._0_8_ = auVar8._0_8_;
          local_d80._8_8_ = auVar8._8_8_;
          local_d80._16_8_ = auVar7._0_8_;
          local_d80._24_8_ = auVar7._8_8_;
          local_25c0 = local_d80._0_8_;
          uStack_25b8 = local_d80._8_8_;
          uStack_25b0 = local_d80._16_8_;
          uStack_25a8 = local_d80._24_8_;
          local_2218 = local_2538 + -4;
          local_25e0 = *local_2218;
          uStack_25d8 = local_2538[-3];
          uStack_25d0 = local_2538[-2];
          uStack_25c8 = local_2538[-1];
          uVar9 = *local_2538;
          uVar10 = local_2538[1];
          uVar11 = local_2538[2];
          uVar12 = local_2538[3];
          local_2228 = local_2538 + 4;
          uVar13 = *local_2228;
          uVar14 = local_2538[5];
          uVar15 = local_2538[6];
          uVar16 = local_2538[7];
          local_2230 = local_2538 + 8;
          uVar17 = *local_2230;
          uVar18 = local_2538[9];
          uVar19 = local_2538[10];
          uVar20 = local_2538[0xb];
          local_1b80._0_4_ = (float)local_25e0;
          local_1b80._4_4_ = (float)((ulong)local_25e0 >> 0x20);
          uStack_1b78._0_4_ = (float)uStack_25d8;
          uStack_1b78._4_4_ = (float)((ulong)uStack_25d8 >> 0x20);
          uStack_1b70._0_4_ = (float)uStack_25d0;
          uStack_1b70._4_4_ = (float)((ulong)uStack_25d0 >> 0x20);
          uStack_1b68._0_4_ = (float)uStack_25c8;
          uStack_1b68._4_4_ = (float)((ulong)uStack_25c8 >> 0x20);
          local_1ba0._0_4_ = auVar2._0_4_;
          local_1ba0._4_4_ = auVar2._4_4_;
          uStack_1b98._0_4_ = auVar2._8_4_;
          uStack_1b98._4_4_ = auVar2._12_4_;
          uStack_1b90._0_4_ = auVar1._0_4_;
          uStack_1b90._4_4_ = auVar1._4_4_;
          uStack_1b88._0_4_ = auVar1._8_4_;
          local_2660 = CONCAT44(local_1b80._4_4_ * local_1ba0._4_4_,
                                (float)local_1b80 * (float)local_1ba0);
          uStack_2658 = CONCAT44(uStack_1b78._4_4_ * uStack_1b98._4_4_,
                                 (float)uStack_1b78 * (float)uStack_1b98);
          uStack_2650 = CONCAT44(uStack_1b70._4_4_ * uStack_1b90._4_4_,
                                 (float)uStack_1b70 * (float)uStack_1b90);
          uStack_2648 = CONCAT44(uStack_1b68._4_4_,(float)uStack_1b68 * (float)uStack_1b88);
          local_f48 = &local_2600;
          local_f50 = &local_2580;
          local_f58 = &local_2660;
          local_2600._0_4_ = (float)uVar9;
          local_f20 = (float)local_2600;
          local_2600._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_f1c = local_2600._4_4_;
          uStack_25f8._0_4_ = (float)uVar10;
          fStack_f18 = (float)uStack_25f8;
          uStack_25f8._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_f14 = uStack_25f8._4_4_;
          uStack_25f0._0_4_ = (float)uVar11;
          fStack_f10 = (float)uStack_25f0;
          uStack_25f0._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_f0c = uStack_25f0._4_4_;
          uStack_25e8._0_4_ = (float)uVar12;
          fStack_f08 = (float)uStack_25e8;
          uStack_25e8._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_f04 = uStack_25e8._4_4_;
          local_f40._0_4_ = auVar4._0_4_;
          local_f40._4_4_ = auVar4._4_4_;
          uStack_f38._0_4_ = auVar4._8_4_;
          uStack_f38._4_4_ = auVar4._12_4_;
          uStack_f30._0_4_ = auVar3._0_4_;
          uStack_f30._4_4_ = auVar3._4_4_;
          uStack_f28._0_4_ = auVar3._8_4_;
          local_920 = (float)local_2600 * (float)local_f40;
          fStack_91c = local_2600._4_4_ * local_f40._4_4_;
          fStack_918 = (float)uStack_25f8 * (float)uStack_f38;
          fStack_914 = uStack_25f8._4_4_ * uStack_f38._4_4_;
          fStack_910 = (float)uStack_25f0 * (float)uStack_f30;
          fStack_90c = uStack_25f0._4_4_ * uStack_f30._4_4_;
          fStack_908 = (float)uStack_25e8 * (float)uStack_f28;
          local_940 = local_2660;
          uStack_938 = uStack_2658;
          uStack_930 = uStack_2650;
          uStack_928 = uStack_2648;
          fVar60 = local_920 + (float)local_1b80 * (float)local_1ba0;
          fVar81 = fStack_91c + local_1b80._4_4_ * local_1ba0._4_4_;
          fVar82 = fStack_918 + (float)uStack_1b78 * (float)uStack_1b98;
          fVar84 = fStack_914 + uStack_1b78._4_4_ * uStack_1b98._4_4_;
          fVar88 = fStack_910 + (float)uStack_1b70 * (float)uStack_1b90;
          fVar97 = fStack_90c + uStack_1b70._4_4_ * uStack_1b90._4_4_;
          fVar107 = fStack_908 + (float)uStack_1b68 * (float)uStack_1b88;
          local_900 = CONCAT44(fVar81,fVar60);
          uStack_8f8 = CONCAT44(fVar84,fVar82);
          uStack_8f0 = CONCAT44(fVar97,fVar88);
          uStack_8e8 = CONCAT44(uStack_25e8._4_4_ + uStack_1b68._4_4_,fVar107);
          local_fa8 = &local_2620;
          local_fb0 = &local_25a0;
          local_fb8 = &local_2660;
          local_2620._0_4_ = (float)uVar13;
          local_f80 = (float)local_2620;
          local_2620._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_f7c = local_2620._4_4_;
          uStack_2618._0_4_ = (float)uVar14;
          fStack_f78 = (float)uStack_2618;
          uStack_2618._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_f74 = uStack_2618._4_4_;
          uStack_2610._0_4_ = (float)uVar15;
          fStack_f70 = (float)uStack_2610;
          uStack_2610._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_f6c = uStack_2610._4_4_;
          uStack_2608._0_4_ = (float)uVar16;
          fStack_f68 = (float)uStack_2608;
          uStack_2608._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_f64 = uStack_2608._4_4_;
          local_fa0._0_4_ = auVar6._0_4_;
          local_fa0._4_4_ = auVar6._4_4_;
          uStack_f98._0_4_ = auVar6._8_4_;
          uStack_f98._4_4_ = auVar6._12_4_;
          uStack_f90._0_4_ = auVar5._0_4_;
          uStack_f90._4_4_ = auVar5._4_4_;
          uStack_f88._0_4_ = auVar5._8_4_;
          local_8e0 = (float)local_2620 * (float)local_fa0;
          fStack_8dc = local_2620._4_4_ * local_fa0._4_4_;
          fStack_8d8 = (float)uStack_2618 * (float)uStack_f98;
          fStack_8d4 = uStack_2618._4_4_ * uStack_f98._4_4_;
          fStack_8d0 = (float)uStack_2610 * (float)uStack_f90;
          fStack_8cc = uStack_2610._4_4_ * uStack_f90._4_4_;
          fStack_8c8 = (float)uStack_2608 * (float)uStack_f88;
          fVar60 = local_8e0 + fVar60;
          fVar81 = fStack_8dc + fVar81;
          fVar82 = fStack_8d8 + fVar82;
          fVar84 = fStack_8d4 + fVar84;
          fVar88 = fStack_8d0 + fVar88;
          fVar97 = fStack_8cc + fVar97;
          fVar107 = fStack_8c8 + fVar107;
          uStack_2608._4_4_ = uStack_2608._4_4_ + uStack_25e8._4_4_ + uStack_1b68._4_4_;
          local_8c0 = CONCAT44(fVar81,fVar60);
          uStack_8b8 = CONCAT44(fVar84,fVar82);
          uStack_8b0 = CONCAT44(fVar97,fVar88);
          uStack_8a8 = CONCAT44(uStack_2608._4_4_,fVar107);
          local_1008 = &local_2640;
          local_1010 = &local_25c0;
          local_1018 = &local_2660;
          local_2640._0_4_ = (float)uVar17;
          local_fe0 = (float)local_2640;
          local_2640._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_fdc = local_2640._4_4_;
          uStack_2638._0_4_ = (float)uVar18;
          fStack_fd8 = (float)uStack_2638;
          uStack_2638._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_fd4 = uStack_2638._4_4_;
          uStack_2630._0_4_ = (float)uVar19;
          fStack_fd0 = (float)uStack_2630;
          uStack_2630._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_fcc = uStack_2630._4_4_;
          uStack_2628._0_4_ = (float)uVar20;
          fStack_fc8 = (float)uStack_2628;
          uStack_2628._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_fc4 = uStack_2628._4_4_;
          local_1000._0_4_ = auVar8._0_4_;
          local_1000._4_4_ = auVar8._4_4_;
          uStack_ff8._0_4_ = auVar8._8_4_;
          uStack_ff8._4_4_ = auVar8._12_4_;
          uStack_ff0._0_4_ = auVar7._0_4_;
          uStack_ff0._4_4_ = auVar7._4_4_;
          uStack_fe8._0_4_ = auVar7._8_4_;
          local_8a0 = (float)local_2640 * (float)local_1000;
          fStack_89c = local_2640._4_4_ * local_1000._4_4_;
          fStack_898 = (float)uStack_2638 * (float)uStack_ff8;
          fStack_894 = uStack_2638._4_4_ * uStack_ff8._4_4_;
          fStack_890 = (float)uStack_2630 * (float)uStack_ff0;
          fStack_88c = uStack_2630._4_4_ * uStack_ff0._4_4_;
          fStack_888 = (float)uStack_2628 * (float)uStack_fe8;
          local_2660 = CONCAT44(fStack_89c + fVar81,local_8a0 + fVar60);
          uStack_2658 = CONCAT44(fStack_894 + fVar84,fStack_898 + fVar82);
          uStack_2650 = CONCAT44(fStack_88c + fVar97,fStack_890 + fVar88);
          uStack_2648 = CONCAT44(uStack_2628._4_4_ + uStack_2608._4_4_,fStack_888 + fVar107);
          local_1e78 = (undefined8 *)((long)puVar59 + (long)(local_252c << 3) * 4);
          *local_1e78 = local_2660;
          local_1e78[1] = uStack_2658;
          local_1e78[2] = uStack_2650;
          local_1e78[3] = uStack_2648;
          local_2520 = local_2520 + 4;
          local_2640 = uVar17;
          uStack_2638 = uVar18;
          uStack_2630 = uVar19;
          uStack_2628 = uVar20;
          local_2620 = uVar13;
          uStack_2618 = uVar14;
          uStack_2610 = uVar15;
          uStack_2608 = uVar16;
          local_2600 = uVar9;
          uStack_25f8 = uVar10;
          uStack_25f0 = uVar11;
          uStack_25e8 = uVar12;
          local_2220 = local_2538;
          local_1ea0 = local_2660;
          uStack_1e98 = uStack_2658;
          uStack_1e90 = uStack_2650;
          uStack_1e88 = uStack_2648;
          local_1ba0 = local_e40._0_8_;
          uStack_1b98 = local_e40._8_8_;
          uStack_1b90 = local_e40._16_8_;
          uStack_1b88 = local_e40._24_8_;
          local_1b80 = local_25e0;
          uStack_1b78 = uStack_25d8;
          uStack_1b70 = uStack_25d0;
          uStack_1b68 = uStack_25c8;
          local_1000 = local_d80._0_8_;
          uStack_ff8 = local_d80._8_8_;
          uStack_ff0 = local_d80._16_8_;
          uStack_fe8 = local_d80._24_8_;
          local_fa0 = local_dc0._0_8_;
          uStack_f98 = local_dc0._8_8_;
          uStack_f90 = local_dc0._16_8_;
          uStack_f88 = local_dc0._24_8_;
          local_f40 = local_e00._0_8_;
          uStack_f38 = local_e00._8_8_;
          uStack_f30 = local_e00._16_8_;
          uStack_f28 = local_e00._24_8_;
          local_e40 = auVar61;
          local_e20 = local_1e24;
          local_e1c = local_1e24;
          local_e18 = local_1e24;
          local_e14 = local_1e24;
          local_e10 = local_1e24;
          local_e0c = local_1e24;
          local_e08 = local_1e24;
          local_e04 = local_1e24;
          local_e00 = auVar62;
          local_de0 = local_1e28;
          local_ddc = local_1e28;
          local_dd8 = local_1e28;
          local_dd4 = local_1e28;
          local_dd0 = local_1e28;
          local_dcc = local_1e28;
          local_dc8 = local_1e28;
          local_dc4 = local_1e28;
          local_dc0 = auVar63;
          local_da0 = local_1e2c;
          local_d9c = local_1e2c;
          local_d98 = local_1e2c;
          local_d94 = local_1e2c;
          local_d90 = local_1e2c;
          local_d8c = local_1e2c;
          local_d88 = local_1e2c;
          local_d84 = local_1e2c;
          local_d80 = auVar64;
          local_d60 = local_1e30;
          local_d5c = local_1e30;
          local_d58 = local_1e30;
          local_d54 = local_1e30;
          local_d50 = local_1e30;
          local_d4c = local_1e30;
          local_d48 = local_1e30;
          local_d44 = local_1e30;
          fStack_904 = fStack_f04;
          fStack_8c4 = fStack_f64;
          fStack_884 = fStack_fc4;
        }
      }
      else if (local_2504 == local_24fc + 2) {
        local_2668 = local_24e0;
        local_2670 = local_24e8;
        local_24e0 = local_24f0;
        local_24e8 = local_24f8;
        local_24f0 = puVar59;
        local_24f8 = puVar58;
        local_214c = local_2504 + 1;
        local_2148 = local_2378;
        local_2678 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_214c * local_2378[2];
        local_215c = local_2504 + 2;
        local_2158 = local_2378;
        local_2680 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_215c * local_2378[2];
        local_2688 = local_2388;
        local_2690 = puVar59;
        local_2698 = puVar58;
        for (local_269c = 0; local_269c < local_23a4; local_269c = local_269c + 1) {
          local_26a0 = *(int *)(local_2390 + (long)local_269c * 4) << 3;
          local_26a8 = (undefined8 *)(local_2678 + (long)local_26a0 * 4);
          local_26b0 = (undefined8 *)(local_2680 + (long)local_26a0 * 4);
          local_1e34 = *local_2688;
          auVar1 = vinsertps_avx(ZEXT416(local_1e34),ZEXT416(local_1e34),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e34),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e34),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_1e34),ZEXT416(local_1e34),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e34),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e34),0x30);
          auVar65._16_16_ = auVar1;
          auVar65._0_16_ = auVar2;
          local_d40._0_8_ = auVar2._0_8_;
          local_d40._8_8_ = auVar2._8_8_;
          local_d40._16_8_ = auVar1._0_8_;
          local_d40._24_8_ = auVar1._8_8_;
          local_26e0 = local_d40._0_8_;
          uStack_26d8 = local_d40._8_8_;
          uStack_26d0 = local_d40._16_8_;
          uStack_26c8 = local_d40._24_8_;
          local_1e38 = local_2688[1];
          auVar3 = vinsertps_avx(ZEXT416(local_1e38),ZEXT416(local_1e38),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e38),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e38),0x30);
          auVar4 = vinsertps_avx(ZEXT416(local_1e38),ZEXT416(local_1e38),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e38),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e38),0x30);
          auVar66._16_16_ = auVar3;
          auVar66._0_16_ = auVar4;
          local_d00._0_8_ = auVar4._0_8_;
          local_d00._8_8_ = auVar4._8_8_;
          local_d00._16_8_ = auVar3._0_8_;
          local_d00._24_8_ = auVar3._8_8_;
          local_2700 = local_d00._0_8_;
          uStack_26f8 = local_d00._8_8_;
          uStack_26f0 = local_d00._16_8_;
          uStack_26e8 = local_d00._24_8_;
          local_1e3c = local_2688[2];
          auVar5 = vinsertps_avx(ZEXT416(local_1e3c),ZEXT416(local_1e3c),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e3c),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e3c),0x30);
          auVar6 = vinsertps_avx(ZEXT416(local_1e3c),ZEXT416(local_1e3c),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e3c),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e3c),0x30);
          auVar67._16_16_ = auVar5;
          auVar67._0_16_ = auVar6;
          local_cc0._0_8_ = auVar6._0_8_;
          local_cc0._8_8_ = auVar6._8_8_;
          local_cc0._16_8_ = auVar5._0_8_;
          local_cc0._24_8_ = auVar5._8_8_;
          local_2720 = local_cc0._0_8_;
          uStack_2718 = local_cc0._8_8_;
          uStack_2710 = local_cc0._16_8_;
          uStack_2708 = local_cc0._24_8_;
          local_1e40 = local_2688[3];
          auVar7 = vinsertps_avx(ZEXT416(local_1e40),ZEXT416(local_1e40),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e40),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e40),0x30);
          auVar8 = vinsertps_avx(ZEXT416(local_1e40),ZEXT416(local_1e40),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e40),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e40),0x30);
          auVar68._16_16_ = auVar7;
          auVar68._0_16_ = auVar8;
          local_c80._0_8_ = auVar8._0_8_;
          local_c80._8_8_ = auVar8._8_8_;
          local_c80._16_8_ = auVar7._0_8_;
          local_c80._24_8_ = auVar7._8_8_;
          local_2740 = local_c80._0_8_;
          uStack_2738 = local_c80._8_8_;
          uStack_2730 = local_c80._16_8_;
          uStack_2728 = local_c80._24_8_;
          local_2238 = local_26a8 + -4;
          local_2760 = *local_2238;
          uStack_2758 = local_26a8[-3];
          uStack_2750 = local_26a8[-2];
          uStack_2748 = local_26a8[-1];
          uVar9 = *local_26a8;
          uVar10 = local_26a8[1];
          uVar11 = local_26a8[2];
          uVar12 = local_26a8[3];
          local_2248 = local_26a8 + 4;
          uVar13 = *local_2248;
          uVar14 = local_26a8[5];
          uVar15 = local_26a8[6];
          uVar16 = local_26a8[7];
          local_2250 = local_26a8 + 8;
          uVar17 = *local_2250;
          uVar18 = local_26a8[9];
          uVar19 = local_26a8[10];
          uVar20 = local_26a8[0xb];
          local_2258 = local_26b0 + -4;
          local_27e0 = *local_2258;
          uStack_27d8 = local_26b0[-3];
          uStack_27d0 = local_26b0[-2];
          uStack_27c8 = local_26b0[-1];
          uVar21 = *local_26b0;
          uVar22 = local_26b0[1];
          uVar23 = local_26b0[2];
          uVar24 = local_26b0[3];
          local_2268 = local_26b0 + 4;
          uVar25 = *local_2268;
          uVar26 = local_26b0[5];
          uVar27 = local_26b0[6];
          uVar28 = local_26b0[7];
          local_2270 = local_26b0 + 8;
          uVar29 = *local_2270;
          uVar30 = local_26b0[9];
          uVar31 = local_26b0[10];
          uVar32 = local_26b0[0xb];
          local_1bc0._0_4_ = (float)local_2760;
          local_1bc0._4_4_ = (float)((ulong)local_2760 >> 0x20);
          uStack_1bb8._0_4_ = (float)uStack_2758;
          uStack_1bb8._4_4_ = (float)((ulong)uStack_2758 >> 0x20);
          uStack_1bb0._0_4_ = (float)uStack_2750;
          uStack_1bb0._4_4_ = (float)((ulong)uStack_2750 >> 0x20);
          uStack_1ba8._0_4_ = (float)uStack_2748;
          uStack_1ba8._4_4_ = (float)((ulong)uStack_2748 >> 0x20);
          local_1be0._0_4_ = auVar2._0_4_;
          local_1be0._4_4_ = auVar2._4_4_;
          uStack_1bd8._0_4_ = auVar2._8_4_;
          uStack_1bd8._4_4_ = auVar2._12_4_;
          uStack_1bd0._0_4_ = auVar1._0_4_;
          uStack_1bd0._4_4_ = auVar1._4_4_;
          uStack_1bc8._0_4_ = auVar1._8_4_;
          local_2860 = CONCAT44(local_1bc0._4_4_ * local_1be0._4_4_,
                                (float)local_1bc0 * (float)local_1be0);
          uStack_2858 = CONCAT44(uStack_1bb8._4_4_ * uStack_1bd8._4_4_,
                                 (float)uStack_1bb8 * (float)uStack_1bd8);
          uStack_2850 = CONCAT44(uStack_1bb0._4_4_ * uStack_1bd0._4_4_,
                                 (float)uStack_1bb0 * (float)uStack_1bd0);
          uStack_2848 = CONCAT44(uStack_1ba8._4_4_,(float)uStack_1ba8 * (float)uStack_1bc8);
          local_1c20 = local_d40._0_8_;
          uStack_1c18 = local_d40._8_8_;
          uStack_1c10 = local_d40._16_8_;
          uStack_1c08 = local_d40._24_8_;
          local_1c00._0_4_ = (float)local_27e0;
          local_1c00._4_4_ = (float)((ulong)local_27e0 >> 0x20);
          uStack_1bf8._0_4_ = (float)uStack_27d8;
          uStack_1bf8._4_4_ = (float)((ulong)uStack_27d8 >> 0x20);
          uStack_1bf0._0_4_ = (float)uStack_27d0;
          uStack_1bf0._4_4_ = (float)((ulong)uStack_27d0 >> 0x20);
          uStack_1be8._0_4_ = (float)uStack_27c8;
          uStack_1be8._4_4_ = (float)((ulong)uStack_27c8 >> 0x20);
          local_2880 = CONCAT44(local_1c00._4_4_ * local_1be0._4_4_,
                                (float)local_1c00 * (float)local_1be0);
          uStack_2878 = CONCAT44(uStack_1bf8._4_4_ * uStack_1bd8._4_4_,
                                 (float)uStack_1bf8 * (float)uStack_1bd8);
          uStack_2870 = CONCAT44(uStack_1bf0._4_4_ * uStack_1bd0._4_4_,
                                 (float)uStack_1bf0 * (float)uStack_1bd0);
          uStack_2868 = CONCAT44(uStack_1be8._4_4_,(float)uStack_1be8 * (float)uStack_1bc8);
          local_1068 = &local_2780;
          local_1070 = &local_2700;
          local_1078 = &local_2860;
          local_2780._0_4_ = (float)uVar9;
          local_1040 = (float)local_2780;
          local_2780._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_103c = local_2780._4_4_;
          uStack_2778._0_4_ = (float)uVar10;
          fStack_1038 = (float)uStack_2778;
          uStack_2778._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_1034 = uStack_2778._4_4_;
          uStack_2770._0_4_ = (float)uVar11;
          fStack_1030 = (float)uStack_2770;
          uStack_2770._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_102c = uStack_2770._4_4_;
          uStack_2768._0_4_ = (float)uVar12;
          fStack_1028 = (float)uStack_2768;
          uStack_2768._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_1024 = uStack_2768._4_4_;
          local_1060._0_4_ = auVar4._0_4_;
          local_1060._4_4_ = auVar4._4_4_;
          uStack_1058._0_4_ = auVar4._8_4_;
          uStack_1058._4_4_ = auVar4._12_4_;
          uStack_1050._0_4_ = auVar3._0_4_;
          uStack_1050._4_4_ = auVar3._4_4_;
          uStack_1048._0_4_ = auVar3._8_4_;
          local_860 = (float)local_2780 * (float)local_1060;
          fStack_85c = local_2780._4_4_ * local_1060._4_4_;
          fStack_858 = (float)uStack_2778 * (float)uStack_1058;
          fStack_854 = uStack_2778._4_4_ * uStack_1058._4_4_;
          fStack_850 = (float)uStack_2770 * (float)uStack_1050;
          fStack_84c = uStack_2770._4_4_ * uStack_1050._4_4_;
          fStack_848 = (float)uStack_2768 * (float)uStack_1048;
          local_880 = local_2860;
          uStack_878 = uStack_2858;
          uStack_870 = uStack_2850;
          uStack_868 = uStack_2848;
          fVar60 = local_860 + (float)local_1bc0 * (float)local_1be0;
          fVar82 = fStack_85c + local_1bc0._4_4_ * local_1be0._4_4_;
          fVar88 = fStack_858 + (float)uStack_1bb8 * (float)uStack_1bd8;
          fVar107 = fStack_854 + uStack_1bb8._4_4_ * uStack_1bd8._4_4_;
          fVar85 = fStack_850 + (float)uStack_1bb0 * (float)uStack_1bd0;
          fVar89 = fStack_84c + uStack_1bb0._4_4_ * uStack_1bd0._4_4_;
          fVar98 = fStack_848 + (float)uStack_1ba8 * (float)uStack_1bc8;
          local_800 = CONCAT44(fVar82,fVar60);
          uStack_7f8 = CONCAT44(fVar107,fVar88);
          uStack_7f0 = CONCAT44(fVar89,fVar85);
          uStack_7e8 = CONCAT44(uStack_2768._4_4_ + uStack_1ba8._4_4_,fVar98);
          local_10c8 = &local_2800;
          local_10d0 = &local_2700;
          local_10d8 = &local_2880;
          local_2800._0_4_ = (float)uVar21;
          local_10a0 = (float)local_2800;
          local_2800._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_109c = local_2800._4_4_;
          uStack_27f8._0_4_ = (float)uVar22;
          fStack_1098 = (float)uStack_27f8;
          uStack_27f8._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_1094 = uStack_27f8._4_4_;
          uStack_27f0._0_4_ = (float)uVar23;
          fStack_1090 = (float)uStack_27f0;
          uStack_27f0._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_108c = uStack_27f0._4_4_;
          uStack_27e8._0_4_ = (float)uVar24;
          fStack_1088 = (float)uStack_27e8;
          uStack_27e8._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_1084 = uStack_27e8._4_4_;
          local_10c0 = local_d00._0_8_;
          uStack_10b8 = local_d00._8_8_;
          uStack_10b0 = local_d00._16_8_;
          uStack_10a8 = local_d00._24_8_;
          local_820 = (float)local_2800 * (float)local_1060;
          fStack_81c = local_2800._4_4_ * local_1060._4_4_;
          fStack_818 = (float)uStack_27f8 * (float)uStack_1058;
          fStack_814 = uStack_27f8._4_4_ * uStack_1058._4_4_;
          fStack_810 = (float)uStack_27f0 * (float)uStack_1050;
          fStack_80c = uStack_27f0._4_4_ * uStack_1050._4_4_;
          fStack_808 = (float)uStack_27e8 * (float)uStack_1048;
          local_840 = local_2880;
          uStack_838 = uStack_2878;
          uStack_830 = uStack_2870;
          uStack_828 = uStack_2868;
          fVar81 = local_820 + (float)local_1c00 * (float)local_1be0;
          fVar84 = fStack_81c + local_1c00._4_4_ * local_1be0._4_4_;
          fVar97 = fStack_818 + (float)uStack_1bf8 * (float)uStack_1bd8;
          fVar83 = fStack_814 + uStack_1bf8._4_4_ * uStack_1bd8._4_4_;
          fVar86 = fStack_810 + (float)uStack_1bf0 * (float)uStack_1bd0;
          fVar90 = fStack_80c + uStack_1bf0._4_4_ * uStack_1bd0._4_4_;
          fVar99 = fStack_808 + (float)uStack_1be8 * (float)uStack_1bc8;
          local_7c0 = CONCAT44(fVar84,fVar81);
          uStack_7b8 = CONCAT44(fVar83,fVar97);
          uStack_7b0 = CONCAT44(fVar90,fVar86);
          uStack_7a8 = CONCAT44(uStack_27e8._4_4_ + uStack_1be8._4_4_,fVar99);
          local_1128 = &local_27a0;
          local_1130 = &local_2720;
          local_1138 = &local_2860;
          local_27a0._0_4_ = (float)uVar13;
          local_1100 = (float)local_27a0;
          local_27a0._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_10fc = local_27a0._4_4_;
          uStack_2798._0_4_ = (float)uVar14;
          fStack_10f8 = (float)uStack_2798;
          uStack_2798._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_10f4 = uStack_2798._4_4_;
          uStack_2790._0_4_ = (float)uVar15;
          fStack_10f0 = (float)uStack_2790;
          uStack_2790._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_10ec = uStack_2790._4_4_;
          uStack_2788._0_4_ = (float)uVar16;
          fStack_10e8 = (float)uStack_2788;
          uStack_2788._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_10e4 = uStack_2788._4_4_;
          local_1120._0_4_ = auVar6._0_4_;
          local_1120._4_4_ = auVar6._4_4_;
          uStack_1118._0_4_ = auVar6._8_4_;
          uStack_1118._4_4_ = auVar6._12_4_;
          uStack_1110._0_4_ = auVar5._0_4_;
          uStack_1110._4_4_ = auVar5._4_4_;
          uStack_1108._0_4_ = auVar5._8_4_;
          local_7e0 = (float)local_27a0 * (float)local_1120;
          fStack_7dc = local_27a0._4_4_ * local_1120._4_4_;
          fStack_7d8 = (float)uStack_2798 * (float)uStack_1118;
          fStack_7d4 = uStack_2798._4_4_ * uStack_1118._4_4_;
          fStack_7d0 = (float)uStack_2790 * (float)uStack_1110;
          fStack_7cc = uStack_2790._4_4_ * uStack_1110._4_4_;
          fStack_7c8 = (float)uStack_2788 * (float)uStack_1108;
          fVar60 = local_7e0 + fVar60;
          fVar82 = fStack_7dc + fVar82;
          fVar88 = fStack_7d8 + fVar88;
          fVar107 = fStack_7d4 + fVar107;
          fVar85 = fStack_7d0 + fVar85;
          fVar89 = fStack_7cc + fVar89;
          fVar98 = fStack_7c8 + fVar98;
          uStack_2788._4_4_ = uStack_2788._4_4_ + uStack_2768._4_4_ + uStack_1ba8._4_4_;
          local_780 = CONCAT44(fVar82,fVar60);
          uStack_778 = CONCAT44(fVar107,fVar88);
          uStack_770 = CONCAT44(fVar89,fVar85);
          uStack_768 = CONCAT44(uStack_2788._4_4_,fVar98);
          local_1188 = &local_2820;
          local_1190 = &local_2720;
          local_1198 = &local_2880;
          local_2820._0_4_ = (float)uVar25;
          local_1160 = (float)local_2820;
          local_2820._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_115c = local_2820._4_4_;
          uStack_2818._0_4_ = (float)uVar26;
          fStack_1158 = (float)uStack_2818;
          uStack_2818._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_1154 = uStack_2818._4_4_;
          uStack_2810._0_4_ = (float)uVar27;
          fStack_1150 = (float)uStack_2810;
          uStack_2810._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_114c = uStack_2810._4_4_;
          uStack_2808._0_4_ = (float)uVar28;
          fStack_1148 = (float)uStack_2808;
          uStack_2808._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_1144 = uStack_2808._4_4_;
          local_1180 = local_cc0._0_8_;
          uStack_1178 = local_cc0._8_8_;
          uStack_1170 = local_cc0._16_8_;
          uStack_1168 = local_cc0._24_8_;
          local_7a0 = (float)local_2820 * (float)local_1120;
          fStack_79c = local_2820._4_4_ * local_1120._4_4_;
          fStack_798 = (float)uStack_2818 * (float)uStack_1118;
          fStack_794 = uStack_2818._4_4_ * uStack_1118._4_4_;
          fStack_790 = (float)uStack_2810 * (float)uStack_1110;
          fStack_78c = uStack_2810._4_4_ * uStack_1110._4_4_;
          fStack_788 = (float)uStack_2808 * (float)uStack_1108;
          fVar81 = local_7a0 + fVar81;
          fVar84 = fStack_79c + fVar84;
          fVar97 = fStack_798 + fVar97;
          fVar83 = fStack_794 + fVar83;
          fVar86 = fStack_790 + fVar86;
          fVar90 = fStack_78c + fVar90;
          fVar99 = fStack_788 + fVar99;
          uStack_2808._4_4_ = uStack_2808._4_4_ + uStack_27e8._4_4_ + uStack_1be8._4_4_;
          local_740 = CONCAT44(fVar84,fVar81);
          uStack_738 = CONCAT44(fVar83,fVar97);
          uStack_730 = CONCAT44(fVar90,fVar86);
          uStack_728 = CONCAT44(uStack_2808._4_4_,fVar99);
          local_11e8 = &local_27c0;
          local_11f0 = &local_2740;
          local_11f8 = &local_2860;
          local_27c0._0_4_ = (float)uVar17;
          local_11c0 = (float)local_27c0;
          local_27c0._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_11bc = local_27c0._4_4_;
          uStack_27b8._0_4_ = (float)uVar18;
          fStack_11b8 = (float)uStack_27b8;
          uStack_27b8._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_11b4 = uStack_27b8._4_4_;
          uStack_27b0._0_4_ = (float)uVar19;
          fStack_11b0 = (float)uStack_27b0;
          uStack_27b0._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_11ac = uStack_27b0._4_4_;
          uStack_27a8._0_4_ = (float)uVar20;
          fStack_11a8 = (float)uStack_27a8;
          uStack_27a8._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_11a4 = uStack_27a8._4_4_;
          local_11e0._0_4_ = auVar8._0_4_;
          local_11e0._4_4_ = auVar8._4_4_;
          uStack_11d8._0_4_ = auVar8._8_4_;
          uStack_11d8._4_4_ = auVar8._12_4_;
          uStack_11d0._0_4_ = auVar7._0_4_;
          uStack_11d0._4_4_ = auVar7._4_4_;
          uStack_11c8._0_4_ = auVar7._8_4_;
          local_760 = (float)local_27c0 * (float)local_11e0;
          fStack_75c = local_27c0._4_4_ * local_11e0._4_4_;
          fStack_758 = (float)uStack_27b8 * (float)uStack_11d8;
          fStack_754 = uStack_27b8._4_4_ * uStack_11d8._4_4_;
          fStack_750 = (float)uStack_27b0 * (float)uStack_11d0;
          fStack_74c = uStack_27b0._4_4_ * uStack_11d0._4_4_;
          fStack_748 = (float)uStack_27a8 * (float)uStack_11c8;
          local_2860 = CONCAT44(fStack_75c + fVar82,local_760 + fVar60);
          uStack_2858 = CONCAT44(fStack_754 + fVar107,fStack_758 + fVar88);
          uStack_2850 = CONCAT44(fStack_74c + fVar89,fStack_750 + fVar85);
          uStack_2848 = CONCAT44(uStack_27a8._4_4_ + uStack_2788._4_4_,fStack_748 + fVar98);
          local_1248 = &local_2840;
          local_1250 = &local_2740;
          local_1258 = &local_2880;
          local_2840._0_4_ = (float)uVar29;
          local_1220 = (float)local_2840;
          local_2840._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_121c = local_2840._4_4_;
          uStack_2838._0_4_ = (float)uVar30;
          fStack_1218 = (float)uStack_2838;
          uStack_2838._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_1214 = uStack_2838._4_4_;
          uStack_2830._0_4_ = (float)uVar31;
          fStack_1210 = (float)uStack_2830;
          uStack_2830._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_120c = uStack_2830._4_4_;
          uStack_2828._0_4_ = (float)uVar32;
          fStack_1208 = (float)uStack_2828;
          uStack_2828._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_1204 = uStack_2828._4_4_;
          local_1240 = local_c80._0_8_;
          uStack_1238 = local_c80._8_8_;
          uStack_1230 = local_c80._16_8_;
          uStack_1228 = local_c80._24_8_;
          local_720 = (float)local_2840 * (float)local_11e0;
          fStack_71c = local_2840._4_4_ * local_11e0._4_4_;
          fStack_718 = (float)uStack_2838 * (float)uStack_11d8;
          fStack_714 = uStack_2838._4_4_ * uStack_11d8._4_4_;
          fStack_710 = (float)uStack_2830 * (float)uStack_11d0;
          fStack_70c = uStack_2830._4_4_ * uStack_11d0._4_4_;
          fStack_708 = (float)uStack_2828 * (float)uStack_11c8;
          local_2880 = CONCAT44(fStack_71c + fVar84,local_720 + fVar81);
          uStack_2878 = CONCAT44(fStack_714 + fVar83,fStack_718 + fVar97);
          uStack_2870 = CONCAT44(fStack_70c + fVar90,fStack_710 + fVar86);
          uStack_2868 = CONCAT44(uStack_2828._4_4_ + uStack_2808._4_4_,fStack_708 + fVar99);
          local_1ea8 = (undefined8 *)((long)puVar59 + (long)(local_269c << 3) * 4);
          *local_1ea8 = local_2860;
          local_1ea8[1] = uStack_2858;
          local_1ea8[2] = uStack_2850;
          local_1ea8[3] = uStack_2848;
          local_1ee8 = (undefined8 *)((long)puVar58 + (long)(local_269c << 3) * 4);
          *local_1ee8 = local_2880;
          local_1ee8[1] = uStack_2878;
          local_1ee8[2] = uStack_2870;
          local_1ee8[3] = uStack_2868;
          local_2688 = local_2688 + 4;
          local_2840 = uVar29;
          uStack_2838 = uVar30;
          uStack_2830 = uVar31;
          uStack_2828 = uVar32;
          local_2820 = uVar25;
          uStack_2818 = uVar26;
          uStack_2810 = uVar27;
          uStack_2808 = uVar28;
          local_2800 = uVar21;
          uStack_27f8 = uVar22;
          uStack_27f0 = uVar23;
          uStack_27e8 = uVar24;
          local_27c0 = uVar17;
          uStack_27b8 = uVar18;
          uStack_27b0 = uVar19;
          uStack_27a8 = uVar20;
          local_27a0 = uVar13;
          uStack_2798 = uVar14;
          uStack_2790 = uVar15;
          uStack_2788 = uVar16;
          local_2780 = uVar9;
          uStack_2778 = uVar10;
          uStack_2770 = uVar11;
          uStack_2768 = uVar12;
          local_2260 = local_26b0;
          local_2240 = local_26a8;
          local_1f20 = local_2880;
          uStack_1f18 = uStack_2878;
          uStack_1f10 = uStack_2870;
          uStack_1f08 = uStack_2868;
          local_1ee0 = local_2860;
          uStack_1ed8 = uStack_2858;
          uStack_1ed0 = uStack_2850;
          uStack_1ec8 = uStack_2848;
          local_1c00 = local_27e0;
          uStack_1bf8 = uStack_27d8;
          uStack_1bf0 = uStack_27d0;
          uStack_1be8 = uStack_27c8;
          local_1be0 = local_d40._0_8_;
          uStack_1bd8 = local_d40._8_8_;
          uStack_1bd0 = local_d40._16_8_;
          uStack_1bc8 = local_d40._24_8_;
          local_1bc0 = local_2760;
          uStack_1bb8 = uStack_2758;
          uStack_1bb0 = uStack_2750;
          uStack_1ba8 = uStack_2748;
          local_11e0 = local_c80._0_8_;
          uStack_11d8 = local_c80._8_8_;
          uStack_11d0 = local_c80._16_8_;
          uStack_11c8 = local_c80._24_8_;
          local_1120 = local_cc0._0_8_;
          uStack_1118 = local_cc0._8_8_;
          uStack_1110 = local_cc0._16_8_;
          uStack_1108 = local_cc0._24_8_;
          local_1060 = local_d00._0_8_;
          uStack_1058 = local_d00._8_8_;
          uStack_1050 = local_d00._16_8_;
          uStack_1048 = local_d00._24_8_;
          local_d40 = auVar65;
          local_d20 = local_1e34;
          local_d1c = local_1e34;
          local_d18 = local_1e34;
          local_d14 = local_1e34;
          local_d10 = local_1e34;
          local_d0c = local_1e34;
          local_d08 = local_1e34;
          local_d04 = local_1e34;
          local_d00 = auVar66;
          local_ce0 = local_1e38;
          local_cdc = local_1e38;
          local_cd8 = local_1e38;
          local_cd4 = local_1e38;
          local_cd0 = local_1e38;
          local_ccc = local_1e38;
          local_cc8 = local_1e38;
          local_cc4 = local_1e38;
          local_cc0 = auVar67;
          local_ca0 = local_1e3c;
          local_c9c = local_1e3c;
          local_c98 = local_1e3c;
          local_c94 = local_1e3c;
          local_c90 = local_1e3c;
          local_c8c = local_1e3c;
          local_c88 = local_1e3c;
          local_c84 = local_1e3c;
          local_c80 = auVar68;
          local_c60 = local_1e40;
          local_c5c = local_1e40;
          local_c58 = local_1e40;
          local_c54 = local_1e40;
          local_c50 = local_1e40;
          local_c4c = local_1e40;
          local_c48 = local_1e40;
          local_c44 = local_1e40;
          fStack_844 = fStack_1024;
          fStack_804 = fStack_1084;
          fStack_7c4 = fStack_10e4;
          fStack_784 = fStack_1144;
          fStack_744 = fStack_11a4;
          fStack_704 = fStack_1204;
        }
      }
      else if (local_2504 == local_24fc + 3) {
        local_2888 = local_24e0;
        local_2890 = local_24e8;
        local_2898 = local_24f0;
        local_24e0 = local_24f8;
        local_24e8 = puVar59;
        local_24f0 = puVar58;
        local_24f8 = puVar57;
        local_2168 = local_2378;
        local_28a0 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_2504 * local_2378[2];
        local_217c = local_2504 + 1;
        local_2178 = local_2378;
        local_28a8 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_217c * local_2378[2];
        local_218c = local_2504 + 2;
        local_2188 = local_2378;
        local_28b0 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_218c * local_2378[2];
        local_28b8 = local_2388;
        local_28c0 = puVar59;
        local_28c8 = puVar58;
        local_28d0 = puVar57;
        for (local_28d4 = 0; local_216c = local_2504, local_28d4 < local_23a4;
            local_28d4 = local_28d4 + 1) {
          local_28d8 = *(int *)(local_2390 + (long)local_28d4 * 4) << 3;
          local_28e0 = (undefined8 *)(local_28a0 + (long)local_28d8 * 4);
          local_28e8 = (undefined8 *)(local_28a8 + (long)local_28d8 * 4);
          local_28f0 = (undefined8 *)(local_28b0 + (long)local_28d8 * 4);
          local_1e44 = *local_28b8;
          auVar1 = vinsertps_avx(ZEXT416(local_1e44),ZEXT416(local_1e44),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e44),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e44),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_1e44),ZEXT416(local_1e44),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e44),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e44),0x30);
          auVar69._16_16_ = auVar1;
          auVar69._0_16_ = auVar2;
          local_c40._0_8_ = auVar2._0_8_;
          local_c40._8_8_ = auVar2._8_8_;
          local_c40._16_8_ = auVar1._0_8_;
          local_c40._24_8_ = auVar1._8_8_;
          local_2920 = local_c40._0_8_;
          uStack_2918 = local_c40._8_8_;
          uStack_2910 = local_c40._16_8_;
          uStack_2908 = local_c40._24_8_;
          local_1e48 = local_28b8[1];
          auVar3 = vinsertps_avx(ZEXT416(local_1e48),ZEXT416(local_1e48),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e48),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e48),0x30);
          auVar4 = vinsertps_avx(ZEXT416(local_1e48),ZEXT416(local_1e48),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e48),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e48),0x30);
          auVar70._16_16_ = auVar3;
          auVar70._0_16_ = auVar4;
          local_c00._0_8_ = auVar4._0_8_;
          local_c00._8_8_ = auVar4._8_8_;
          local_c00._16_8_ = auVar3._0_8_;
          local_c00._24_8_ = auVar3._8_8_;
          local_2940 = local_c00._0_8_;
          uStack_2938 = local_c00._8_8_;
          uStack_2930 = local_c00._16_8_;
          uStack_2928 = local_c00._24_8_;
          local_1e4c = local_28b8[2];
          auVar5 = vinsertps_avx(ZEXT416(local_1e4c),ZEXT416(local_1e4c),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e4c),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e4c),0x30);
          auVar6 = vinsertps_avx(ZEXT416(local_1e4c),ZEXT416(local_1e4c),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e4c),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e4c),0x30);
          auVar71._16_16_ = auVar5;
          auVar71._0_16_ = auVar6;
          local_bc0._0_8_ = auVar6._0_8_;
          local_bc0._8_8_ = auVar6._8_8_;
          local_bc0._16_8_ = auVar5._0_8_;
          local_bc0._24_8_ = auVar5._8_8_;
          local_2960 = local_bc0._0_8_;
          uStack_2958 = local_bc0._8_8_;
          uStack_2950 = local_bc0._16_8_;
          uStack_2948 = local_bc0._24_8_;
          local_1e50 = local_28b8[3];
          auVar7 = vinsertps_avx(ZEXT416(local_1e50),ZEXT416(local_1e50),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e50),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e50),0x30);
          auVar8 = vinsertps_avx(ZEXT416(local_1e50),ZEXT416(local_1e50),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e50),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e50),0x30);
          auVar72._16_16_ = auVar7;
          auVar72._0_16_ = auVar8;
          local_b80._0_8_ = auVar8._0_8_;
          local_b80._8_8_ = auVar8._8_8_;
          local_b80._16_8_ = auVar7._0_8_;
          local_b80._24_8_ = auVar7._8_8_;
          local_2980 = local_b80._0_8_;
          uStack_2978 = local_b80._8_8_;
          uStack_2970 = local_b80._16_8_;
          uStack_2968 = local_b80._24_8_;
          local_2278 = local_28e0 + -4;
          local_29a0 = *local_2278;
          uStack_2998 = local_28e0[-3];
          uStack_2990 = local_28e0[-2];
          uStack_2988 = local_28e0[-1];
          uVar9 = *local_28e0;
          uVar10 = local_28e0[1];
          uVar11 = local_28e0[2];
          uVar12 = local_28e0[3];
          local_2288 = local_28e0 + 4;
          uVar13 = *local_2288;
          uVar14 = local_28e0[5];
          uVar15 = local_28e0[6];
          uVar16 = local_28e0[7];
          local_2290 = local_28e0 + 8;
          uVar17 = *local_2290;
          uVar18 = local_28e0[9];
          uVar19 = local_28e0[10];
          uVar20 = local_28e0[0xb];
          local_2298 = local_28e8 + -4;
          local_2a20 = *local_2298;
          uStack_2a18 = local_28e8[-3];
          uStack_2a10 = local_28e8[-2];
          uStack_2a08 = local_28e8[-1];
          uVar21 = *local_28e8;
          uVar22 = local_28e8[1];
          uVar23 = local_28e8[2];
          uVar24 = local_28e8[3];
          local_22a8 = local_28e8 + 4;
          uVar25 = *local_22a8;
          uVar26 = local_28e8[5];
          uVar27 = local_28e8[6];
          uVar28 = local_28e8[7];
          local_22b0 = local_28e8 + 8;
          uVar29 = *local_22b0;
          uVar30 = local_28e8[9];
          uVar31 = local_28e8[10];
          uVar32 = local_28e8[0xb];
          local_22b8 = local_28f0 + -4;
          local_2aa0 = *local_22b8;
          uStack_2a98 = local_28f0[-3];
          uStack_2a90 = local_28f0[-2];
          uStack_2a88 = local_28f0[-1];
          uVar33 = *local_28f0;
          uVar34 = local_28f0[1];
          uVar35 = local_28f0[2];
          uVar36 = local_28f0[3];
          local_22c8 = local_28f0 + 4;
          uVar37 = *local_22c8;
          uVar38 = local_28f0[5];
          uVar39 = local_28f0[6];
          uVar40 = local_28f0[7];
          local_22d0 = local_28f0 + 8;
          uVar41 = *local_22d0;
          uVar42 = local_28f0[9];
          uVar43 = local_28f0[10];
          uVar44 = local_28f0[0xb];
          local_1c40._0_4_ = (float)local_29a0;
          local_1c40._4_4_ = (float)((ulong)local_29a0 >> 0x20);
          uStack_1c38._0_4_ = (float)uStack_2998;
          uStack_1c38._4_4_ = (float)((ulong)uStack_2998 >> 0x20);
          uStack_1c30._0_4_ = (float)uStack_2990;
          uStack_1c30._4_4_ = (float)((ulong)uStack_2990 >> 0x20);
          uStack_1c28._0_4_ = (float)uStack_2988;
          uStack_1c28._4_4_ = (float)((ulong)uStack_2988 >> 0x20);
          local_1c60._0_4_ = auVar2._0_4_;
          local_1c60._4_4_ = auVar2._4_4_;
          uStack_1c58._0_4_ = auVar2._8_4_;
          uStack_1c58._4_4_ = auVar2._12_4_;
          uStack_1c50._0_4_ = auVar1._0_4_;
          uStack_1c50._4_4_ = auVar1._4_4_;
          uStack_1c48._0_4_ = auVar1._8_4_;
          local_2b20 = CONCAT44(local_1c40._4_4_ * local_1c60._4_4_,
                                (float)local_1c40 * (float)local_1c60);
          uStack_2b18 = CONCAT44(uStack_1c38._4_4_ * uStack_1c58._4_4_,
                                 (float)uStack_1c38 * (float)uStack_1c58);
          uStack_2b10 = CONCAT44(uStack_1c30._4_4_ * uStack_1c50._4_4_,
                                 (float)uStack_1c30 * (float)uStack_1c50);
          uStack_2b08 = CONCAT44(uStack_1c28._4_4_,(float)uStack_1c28 * (float)uStack_1c48);
          local_1ca0 = local_c40._0_8_;
          uStack_1c98 = local_c40._8_8_;
          uStack_1c90 = local_c40._16_8_;
          uStack_1c88 = local_c40._24_8_;
          local_1c80._0_4_ = (float)local_2a20;
          local_1c80._4_4_ = (float)((ulong)local_2a20 >> 0x20);
          uStack_1c78._0_4_ = (float)uStack_2a18;
          uStack_1c78._4_4_ = (float)((ulong)uStack_2a18 >> 0x20);
          uStack_1c70._0_4_ = (float)uStack_2a10;
          uStack_1c70._4_4_ = (float)((ulong)uStack_2a10 >> 0x20);
          uStack_1c68._0_4_ = (float)uStack_2a08;
          uStack_1c68._4_4_ = (float)((ulong)uStack_2a08 >> 0x20);
          local_2b40 = CONCAT44(local_1c80._4_4_ * local_1c60._4_4_,
                                (float)local_1c80 * (float)local_1c60);
          uStack_2b38 = CONCAT44(uStack_1c78._4_4_ * uStack_1c58._4_4_,
                                 (float)uStack_1c78 * (float)uStack_1c58);
          uStack_2b30 = CONCAT44(uStack_1c70._4_4_ * uStack_1c50._4_4_,
                                 (float)uStack_1c70 * (float)uStack_1c50);
          uStack_2b28 = CONCAT44(uStack_1c68._4_4_,(float)uStack_1c68 * (float)uStack_1c48);
          local_1ce0 = local_c40._0_8_;
          uStack_1cd8 = local_c40._8_8_;
          uStack_1cd0 = local_c40._16_8_;
          uStack_1cc8 = local_c40._24_8_;
          local_1cc0._0_4_ = (float)local_2aa0;
          local_1cc0._4_4_ = (float)((ulong)local_2aa0 >> 0x20);
          uStack_1cb8._0_4_ = (float)uStack_2a98;
          uStack_1cb8._4_4_ = (float)((ulong)uStack_2a98 >> 0x20);
          uStack_1cb0._0_4_ = (float)uStack_2a90;
          uStack_1cb0._4_4_ = (float)((ulong)uStack_2a90 >> 0x20);
          uStack_1ca8._0_4_ = (float)uStack_2a88;
          uStack_1ca8._4_4_ = (float)((ulong)uStack_2a88 >> 0x20);
          local_2b60 = CONCAT44(local_1cc0._4_4_ * local_1c60._4_4_,
                                (float)local_1cc0 * (float)local_1c60);
          uStack_2b58 = CONCAT44(uStack_1cb8._4_4_ * uStack_1c58._4_4_,
                                 (float)uStack_1cb8 * (float)uStack_1c58);
          uStack_2b50 = CONCAT44(uStack_1cb0._4_4_ * uStack_1c50._4_4_,
                                 (float)uStack_1cb0 * (float)uStack_1c50);
          uStack_2b48 = CONCAT44(uStack_1ca8._4_4_,(float)uStack_1ca8 * (float)uStack_1c48);
          local_12a8 = &local_29c0;
          local_12b0 = &local_2940;
          local_12b8 = &local_2b20;
          local_29c0._0_4_ = (float)uVar9;
          local_1280 = (float)local_29c0;
          local_29c0._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_127c = local_29c0._4_4_;
          uStack_29b8._0_4_ = (float)uVar10;
          fStack_1278 = (float)uStack_29b8;
          uStack_29b8._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_1274 = uStack_29b8._4_4_;
          uStack_29b0._0_4_ = (float)uVar11;
          fStack_1270 = (float)uStack_29b0;
          uStack_29b0._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_126c = uStack_29b0._4_4_;
          uStack_29a8._0_4_ = (float)uVar12;
          fStack_1268 = (float)uStack_29a8;
          uStack_29a8._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_1264 = uStack_29a8._4_4_;
          local_12a0._0_4_ = auVar4._0_4_;
          local_12a0._4_4_ = auVar4._4_4_;
          uStack_1298._0_4_ = auVar4._8_4_;
          uStack_1298._4_4_ = auVar4._12_4_;
          uStack_1290._0_4_ = auVar3._0_4_;
          uStack_1290._4_4_ = auVar3._4_4_;
          uStack_1288._0_4_ = auVar3._8_4_;
          local_6e0 = (float)local_29c0 * (float)local_12a0;
          fStack_6dc = local_29c0._4_4_ * local_12a0._4_4_;
          fStack_6d8 = (float)uStack_29b8 * (float)uStack_1298;
          fStack_6d4 = uStack_29b8._4_4_ * uStack_1298._4_4_;
          fStack_6d0 = (float)uStack_29b0 * (float)uStack_1290;
          fStack_6cc = uStack_29b0._4_4_ * uStack_1290._4_4_;
          fStack_6c8 = (float)uStack_29a8 * (float)uStack_1288;
          local_700 = local_2b20;
          uStack_6f8 = uStack_2b18;
          uStack_6f0 = uStack_2b10;
          uStack_6e8 = uStack_2b08;
          fVar60 = local_6e0 + (float)local_1c40 * (float)local_1c60;
          fVar84 = fStack_6dc + local_1c40._4_4_ * local_1c60._4_4_;
          fVar107 = fStack_6d8 + (float)uStack_1c38 * (float)uStack_1c58;
          fVar86 = fStack_6d4 + uStack_1c38._4_4_ * uStack_1c58._4_4_;
          fVar98 = fStack_6d0 + (float)uStack_1c30 * (float)uStack_1c50;
          fVar91 = fStack_6cc + uStack_1c30._4_4_ * uStack_1c50._4_4_;
          fVar100 = fStack_6c8 + (float)uStack_1c28 * (float)uStack_1c48;
          local_640 = CONCAT44(fVar84,fVar60);
          uStack_638 = CONCAT44(fVar86,fVar107);
          uStack_630 = CONCAT44(fVar91,fVar98);
          uStack_628 = CONCAT44(uStack_29a8._4_4_ + uStack_1c28._4_4_,fVar100);
          local_1308 = &local_2a40;
          local_1310 = &local_2940;
          local_1318 = &local_2b40;
          local_2a40._0_4_ = (float)uVar21;
          local_12e0 = (float)local_2a40;
          local_2a40._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_12dc = local_2a40._4_4_;
          uStack_2a38._0_4_ = (float)uVar22;
          fStack_12d8 = (float)uStack_2a38;
          uStack_2a38._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_12d4 = uStack_2a38._4_4_;
          uStack_2a30._0_4_ = (float)uVar23;
          fStack_12d0 = (float)uStack_2a30;
          uStack_2a30._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_12cc = uStack_2a30._4_4_;
          uStack_2a28._0_4_ = (float)uVar24;
          fStack_12c8 = (float)uStack_2a28;
          uStack_2a28._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_12c4 = uStack_2a28._4_4_;
          local_1300 = local_c00._0_8_;
          uStack_12f8 = local_c00._8_8_;
          uStack_12f0 = local_c00._16_8_;
          uStack_12e8 = local_c00._24_8_;
          local_6a0 = (float)local_2a40 * (float)local_12a0;
          fStack_69c = local_2a40._4_4_ * local_12a0._4_4_;
          fStack_698 = (float)uStack_2a38 * (float)uStack_1298;
          fStack_694 = uStack_2a38._4_4_ * uStack_1298._4_4_;
          fStack_690 = (float)uStack_2a30 * (float)uStack_1290;
          fStack_68c = uStack_2a30._4_4_ * uStack_1290._4_4_;
          fStack_688 = (float)uStack_2a28 * (float)uStack_1288;
          local_6c0 = local_2b40;
          uStack_6b8 = uStack_2b38;
          uStack_6b0 = uStack_2b30;
          uStack_6a8 = uStack_2b28;
          fVar81 = local_6a0 + (float)local_1c80 * (float)local_1c60;
          fVar88 = fStack_69c + local_1c80._4_4_ * local_1c60._4_4_;
          fVar83 = fStack_698 + (float)uStack_1c78 * (float)uStack_1c58;
          fVar89 = fStack_694 + uStack_1c78._4_4_ * uStack_1c58._4_4_;
          fVar99 = fStack_690 + (float)uStack_1c70 * (float)uStack_1c50;
          fVar92 = fStack_68c + uStack_1c70._4_4_ * uStack_1c50._4_4_;
          fVar101 = fStack_688 + (float)uStack_1c68 * (float)uStack_1c48;
          local_600 = CONCAT44(fVar88,fVar81);
          uStack_5f8 = CONCAT44(fVar89,fVar83);
          uStack_5f0 = CONCAT44(fVar92,fVar99);
          uStack_5e8 = CONCAT44(uStack_2a28._4_4_ + uStack_1c68._4_4_,fVar101);
          local_1368 = &local_2ac0;
          local_1370 = &local_2940;
          local_1378 = &local_2b60;
          local_2ac0._0_4_ = (float)uVar33;
          local_1340 = (float)local_2ac0;
          local_2ac0._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_133c = local_2ac0._4_4_;
          uStack_2ab8._0_4_ = (float)uVar34;
          fStack_1338 = (float)uStack_2ab8;
          uStack_2ab8._4_4_ = (float)((ulong)uVar34 >> 0x20);
          fStack_1334 = uStack_2ab8._4_4_;
          uStack_2ab0._0_4_ = (float)uVar35;
          fStack_1330 = (float)uStack_2ab0;
          uStack_2ab0._4_4_ = (float)((ulong)uVar35 >> 0x20);
          fStack_132c = uStack_2ab0._4_4_;
          uStack_2aa8._0_4_ = (float)uVar36;
          fStack_1328 = (float)uStack_2aa8;
          uStack_2aa8._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_1324 = uStack_2aa8._4_4_;
          local_1360 = local_c00._0_8_;
          uStack_1358 = local_c00._8_8_;
          uStack_1350 = local_c00._16_8_;
          uStack_1348 = local_c00._24_8_;
          local_660 = (float)local_2ac0 * (float)local_12a0;
          fStack_65c = local_2ac0._4_4_ * local_12a0._4_4_;
          fStack_658 = (float)uStack_2ab8 * (float)uStack_1298;
          fStack_654 = uStack_2ab8._4_4_ * uStack_1298._4_4_;
          fStack_650 = (float)uStack_2ab0 * (float)uStack_1290;
          fStack_64c = uStack_2ab0._4_4_ * uStack_1290._4_4_;
          fStack_648 = (float)uStack_2aa8 * (float)uStack_1288;
          local_680 = local_2b60;
          uStack_678 = uStack_2b58;
          uStack_670 = uStack_2b50;
          uStack_668 = uStack_2b48;
          fVar82 = local_660 + (float)local_1cc0 * (float)local_1c60;
          fVar97 = fStack_65c + local_1cc0._4_4_ * local_1c60._4_4_;
          fVar85 = fStack_658 + (float)uStack_1cb8 * (float)uStack_1c58;
          fVar90 = fStack_654 + uStack_1cb8._4_4_ * uStack_1c58._4_4_;
          fVar87 = fStack_650 + (float)uStack_1cb0 * (float)uStack_1c50;
          fVar93 = fStack_64c + uStack_1cb0._4_4_ * uStack_1c50._4_4_;
          fVar102 = fStack_648 + (float)uStack_1ca8 * (float)uStack_1c48;
          local_5c0 = CONCAT44(fVar97,fVar82);
          uStack_5b8 = CONCAT44(fVar90,fVar85);
          uStack_5b0 = CONCAT44(fVar93,fVar87);
          uStack_5a8 = CONCAT44(uStack_2aa8._4_4_ + uStack_1ca8._4_4_,fVar102);
          local_13c8 = &local_29e0;
          local_13d0 = &local_2960;
          local_13d8 = &local_2b20;
          local_29e0._0_4_ = (float)uVar13;
          local_13a0 = (float)local_29e0;
          local_29e0._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_139c = local_29e0._4_4_;
          uStack_29d8._0_4_ = (float)uVar14;
          fStack_1398 = (float)uStack_29d8;
          uStack_29d8._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_1394 = uStack_29d8._4_4_;
          uStack_29d0._0_4_ = (float)uVar15;
          fStack_1390 = (float)uStack_29d0;
          uStack_29d0._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_138c = uStack_29d0._4_4_;
          uStack_29c8._0_4_ = (float)uVar16;
          fStack_1388 = (float)uStack_29c8;
          uStack_29c8._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_1384 = uStack_29c8._4_4_;
          local_13c0._0_4_ = auVar6._0_4_;
          local_13c0._4_4_ = auVar6._4_4_;
          uStack_13b8._0_4_ = auVar6._8_4_;
          uStack_13b8._4_4_ = auVar6._12_4_;
          uStack_13b0._0_4_ = auVar5._0_4_;
          uStack_13b0._4_4_ = auVar5._4_4_;
          uStack_13a8._0_4_ = auVar5._8_4_;
          local_620 = (float)local_29e0 * (float)local_13c0;
          fStack_61c = local_29e0._4_4_ * local_13c0._4_4_;
          fStack_618 = (float)uStack_29d8 * (float)uStack_13b8;
          fStack_614 = uStack_29d8._4_4_ * uStack_13b8._4_4_;
          fStack_610 = (float)uStack_29d0 * (float)uStack_13b0;
          fStack_60c = uStack_29d0._4_4_ * uStack_13b0._4_4_;
          fStack_608 = (float)uStack_29c8 * (float)uStack_13a8;
          fVar60 = local_620 + fVar60;
          fVar84 = fStack_61c + fVar84;
          fVar107 = fStack_618 + fVar107;
          fVar86 = fStack_614 + fVar86;
          fVar98 = fStack_610 + fVar98;
          fVar91 = fStack_60c + fVar91;
          fVar100 = fStack_608 + fVar100;
          uStack_29c8._4_4_ = uStack_29c8._4_4_ + uStack_29a8._4_4_ + uStack_1c28._4_4_;
          local_580 = CONCAT44(fVar84,fVar60);
          uStack_578 = CONCAT44(fVar86,fVar107);
          uStack_570 = CONCAT44(fVar91,fVar98);
          uStack_568 = CONCAT44(uStack_29c8._4_4_,fVar100);
          local_1428 = &local_2a60;
          local_1430 = &local_2960;
          local_1438 = &local_2b40;
          local_2a60._0_4_ = (float)uVar25;
          local_1400 = (float)local_2a60;
          local_2a60._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_13fc = local_2a60._4_4_;
          uStack_2a58._0_4_ = (float)uVar26;
          fStack_13f8 = (float)uStack_2a58;
          uStack_2a58._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_13f4 = uStack_2a58._4_4_;
          uStack_2a50._0_4_ = (float)uVar27;
          fStack_13f0 = (float)uStack_2a50;
          uStack_2a50._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_13ec = uStack_2a50._4_4_;
          uStack_2a48._0_4_ = (float)uVar28;
          fStack_13e8 = (float)uStack_2a48;
          uStack_2a48._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_13e4 = uStack_2a48._4_4_;
          local_1420 = local_bc0._0_8_;
          uStack_1418 = local_bc0._8_8_;
          uStack_1410 = local_bc0._16_8_;
          uStack_1408 = local_bc0._24_8_;
          local_5e0 = (float)local_2a60 * (float)local_13c0;
          fStack_5dc = local_2a60._4_4_ * local_13c0._4_4_;
          fStack_5d8 = (float)uStack_2a58 * (float)uStack_13b8;
          fStack_5d4 = uStack_2a58._4_4_ * uStack_13b8._4_4_;
          fStack_5d0 = (float)uStack_2a50 * (float)uStack_13b0;
          fStack_5cc = uStack_2a50._4_4_ * uStack_13b0._4_4_;
          fStack_5c8 = (float)uStack_2a48 * (float)uStack_13a8;
          fVar81 = local_5e0 + fVar81;
          fVar88 = fStack_5dc + fVar88;
          fVar83 = fStack_5d8 + fVar83;
          fVar89 = fStack_5d4 + fVar89;
          fVar99 = fStack_5d0 + fVar99;
          fVar92 = fStack_5cc + fVar92;
          fVar101 = fStack_5c8 + fVar101;
          uStack_2a48._4_4_ = uStack_2a48._4_4_ + uStack_2a28._4_4_ + uStack_1c68._4_4_;
          local_540 = CONCAT44(fVar88,fVar81);
          uStack_538 = CONCAT44(fVar89,fVar83);
          uStack_530 = CONCAT44(fVar92,fVar99);
          uStack_528 = CONCAT44(uStack_2a48._4_4_,fVar101);
          local_1488 = &local_2ae0;
          local_1490 = &local_2960;
          local_1498 = &local_2b60;
          local_2ae0._0_4_ = (float)uVar37;
          local_1460 = (float)local_2ae0;
          local_2ae0._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_145c = local_2ae0._4_4_;
          uStack_2ad8._0_4_ = (float)uVar38;
          fStack_1458 = (float)uStack_2ad8;
          uStack_2ad8._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_1454 = uStack_2ad8._4_4_;
          uStack_2ad0._0_4_ = (float)uVar39;
          fStack_1450 = (float)uStack_2ad0;
          uStack_2ad0._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_144c = uStack_2ad0._4_4_;
          uStack_2ac8._0_4_ = (float)uVar40;
          fStack_1448 = (float)uStack_2ac8;
          uStack_2ac8._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_1444 = uStack_2ac8._4_4_;
          local_1480 = local_bc0._0_8_;
          uStack_1478 = local_bc0._8_8_;
          uStack_1470 = local_bc0._16_8_;
          uStack_1468 = local_bc0._24_8_;
          local_5a0 = (float)local_2ae0 * (float)local_13c0;
          fStack_59c = local_2ae0._4_4_ * local_13c0._4_4_;
          fStack_598 = (float)uStack_2ad8 * (float)uStack_13b8;
          fStack_594 = uStack_2ad8._4_4_ * uStack_13b8._4_4_;
          fStack_590 = (float)uStack_2ad0 * (float)uStack_13b0;
          fStack_58c = uStack_2ad0._4_4_ * uStack_13b0._4_4_;
          fStack_588 = (float)uStack_2ac8 * (float)uStack_13a8;
          fVar82 = local_5a0 + fVar82;
          fVar97 = fStack_59c + fVar97;
          fVar85 = fStack_598 + fVar85;
          fVar90 = fStack_594 + fVar90;
          fVar87 = fStack_590 + fVar87;
          fVar93 = fStack_58c + fVar93;
          fVar102 = fStack_588 + fVar102;
          uStack_2ac8._4_4_ = uStack_2ac8._4_4_ + uStack_2aa8._4_4_ + uStack_1ca8._4_4_;
          local_500 = CONCAT44(fVar97,fVar82);
          uStack_4f8 = CONCAT44(fVar90,fVar85);
          uStack_4f0 = CONCAT44(fVar93,fVar87);
          uStack_4e8 = CONCAT44(uStack_2ac8._4_4_,fVar102);
          local_14e8 = &local_2a00;
          local_14f0 = &local_2980;
          local_14f8 = &local_2b20;
          local_2a00._0_4_ = (float)uVar17;
          local_14c0 = (float)local_2a00;
          local_2a00._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_14bc = local_2a00._4_4_;
          uStack_29f8._0_4_ = (float)uVar18;
          fStack_14b8 = (float)uStack_29f8;
          uStack_29f8._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_14b4 = uStack_29f8._4_4_;
          uStack_29f0._0_4_ = (float)uVar19;
          fStack_14b0 = (float)uStack_29f0;
          uStack_29f0._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_14ac = uStack_29f0._4_4_;
          uStack_29e8._0_4_ = (float)uVar20;
          fStack_14a8 = (float)uStack_29e8;
          uStack_29e8._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_14a4 = uStack_29e8._4_4_;
          local_14e0._0_4_ = auVar8._0_4_;
          local_14e0._4_4_ = auVar8._4_4_;
          uStack_14d8._0_4_ = auVar8._8_4_;
          uStack_14d8._4_4_ = auVar8._12_4_;
          uStack_14d0._0_4_ = auVar7._0_4_;
          uStack_14d0._4_4_ = auVar7._4_4_;
          uStack_14c8._0_4_ = auVar7._8_4_;
          local_560 = (float)local_2a00 * (float)local_14e0;
          fStack_55c = local_2a00._4_4_ * local_14e0._4_4_;
          fStack_558 = (float)uStack_29f8 * (float)uStack_14d8;
          fStack_554 = uStack_29f8._4_4_ * uStack_14d8._4_4_;
          fStack_550 = (float)uStack_29f0 * (float)uStack_14d0;
          fStack_54c = uStack_29f0._4_4_ * uStack_14d0._4_4_;
          fStack_548 = (float)uStack_29e8 * (float)uStack_14c8;
          local_2b20 = CONCAT44(fStack_55c + fVar84,local_560 + fVar60);
          uStack_2b18 = CONCAT44(fStack_554 + fVar86,fStack_558 + fVar107);
          uStack_2b10 = CONCAT44(fStack_54c + fVar91,fStack_550 + fVar98);
          uStack_2b08 = CONCAT44(uStack_29e8._4_4_ + uStack_29c8._4_4_,fStack_548 + fVar100);
          local_1548 = &local_2a80;
          local_1550 = &local_2980;
          local_1558 = &local_2b40;
          local_2a80._0_4_ = (float)uVar29;
          local_1520 = (float)local_2a80;
          local_2a80._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_151c = local_2a80._4_4_;
          uStack_2a78._0_4_ = (float)uVar30;
          fStack_1518 = (float)uStack_2a78;
          uStack_2a78._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_1514 = uStack_2a78._4_4_;
          uStack_2a70._0_4_ = (float)uVar31;
          fStack_1510 = (float)uStack_2a70;
          uStack_2a70._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_150c = uStack_2a70._4_4_;
          uStack_2a68._0_4_ = (float)uVar32;
          fStack_1508 = (float)uStack_2a68;
          uStack_2a68._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_1504 = uStack_2a68._4_4_;
          local_1540 = local_b80._0_8_;
          uStack_1538 = local_b80._8_8_;
          uStack_1530 = local_b80._16_8_;
          uStack_1528 = local_b80._24_8_;
          local_520 = (float)local_2a80 * (float)local_14e0;
          fStack_51c = local_2a80._4_4_ * local_14e0._4_4_;
          fStack_518 = (float)uStack_2a78 * (float)uStack_14d8;
          fStack_514 = uStack_2a78._4_4_ * uStack_14d8._4_4_;
          fStack_510 = (float)uStack_2a70 * (float)uStack_14d0;
          fStack_50c = uStack_2a70._4_4_ * uStack_14d0._4_4_;
          fStack_508 = (float)uStack_2a68 * (float)uStack_14c8;
          local_2b40 = CONCAT44(fStack_51c + fVar88,local_520 + fVar81);
          uStack_2b38 = CONCAT44(fStack_514 + fVar89,fStack_518 + fVar83);
          uStack_2b30 = CONCAT44(fStack_50c + fVar92,fStack_510 + fVar99);
          uStack_2b28 = CONCAT44(uStack_2a68._4_4_ + uStack_2a48._4_4_,fStack_508 + fVar101);
          local_15a8 = &local_2b00;
          local_15b0 = &local_2980;
          local_15b8 = &local_2b60;
          local_2b00._0_4_ = (float)uVar41;
          local_1580 = (float)local_2b00;
          local_2b00._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_157c = local_2b00._4_4_;
          uStack_2af8._0_4_ = (float)uVar42;
          fStack_1578 = (float)uStack_2af8;
          uStack_2af8._4_4_ = (float)((ulong)uVar42 >> 0x20);
          fStack_1574 = uStack_2af8._4_4_;
          uStack_2af0._0_4_ = (float)uVar43;
          fStack_1570 = (float)uStack_2af0;
          uStack_2af0._4_4_ = (float)((ulong)uVar43 >> 0x20);
          fStack_156c = uStack_2af0._4_4_;
          uStack_2ae8._0_4_ = (float)uVar44;
          fStack_1568 = (float)uStack_2ae8;
          uStack_2ae8._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_1564 = uStack_2ae8._4_4_;
          local_15a0 = local_b80._0_8_;
          uStack_1598 = local_b80._8_8_;
          uStack_1590 = local_b80._16_8_;
          uStack_1588 = local_b80._24_8_;
          local_4e0 = (float)local_2b00 * (float)local_14e0;
          fStack_4dc = local_2b00._4_4_ * local_14e0._4_4_;
          fStack_4d8 = (float)uStack_2af8 * (float)uStack_14d8;
          fStack_4d4 = uStack_2af8._4_4_ * uStack_14d8._4_4_;
          fStack_4d0 = (float)uStack_2af0 * (float)uStack_14d0;
          fStack_4cc = uStack_2af0._4_4_ * uStack_14d0._4_4_;
          fStack_4c8 = (float)uStack_2ae8 * (float)uStack_14c8;
          local_2b60 = CONCAT44(fStack_4dc + fVar97,local_4e0 + fVar82);
          uStack_2b58 = CONCAT44(fStack_4d4 + fVar90,fStack_4d8 + fVar85);
          uStack_2b50 = CONCAT44(fStack_4cc + fVar93,fStack_4d0 + fVar87);
          uStack_2b48 = CONCAT44(uStack_2ae8._4_4_ + uStack_2ac8._4_4_,fStack_4c8 + fVar102);
          local_1f28 = (undefined8 *)((long)puVar59 + (long)(local_28d4 << 3) * 4);
          *local_1f28 = local_2b20;
          local_1f28[1] = uStack_2b18;
          local_1f28[2] = uStack_2b10;
          local_1f28[3] = uStack_2b08;
          local_1f68 = (undefined8 *)((long)puVar58 + (long)(local_28d4 << 3) * 4);
          *local_1f68 = local_2b40;
          local_1f68[1] = uStack_2b38;
          local_1f68[2] = uStack_2b30;
          local_1f68[3] = uStack_2b28;
          local_1fa8 = (undefined8 *)((long)puVar57 + (long)(local_28d4 << 3) * 4);
          *local_1fa8 = local_2b60;
          local_1fa8[1] = uStack_2b58;
          local_1fa8[2] = uStack_2b50;
          local_1fa8[3] = uStack_2b48;
          local_28b8 = local_28b8 + 4;
          local_2b00 = uVar41;
          uStack_2af8 = uVar42;
          uStack_2af0 = uVar43;
          uStack_2ae8 = uVar44;
          local_2ae0 = uVar37;
          uStack_2ad8 = uVar38;
          uStack_2ad0 = uVar39;
          uStack_2ac8 = uVar40;
          local_2ac0 = uVar33;
          uStack_2ab8 = uVar34;
          uStack_2ab0 = uVar35;
          uStack_2aa8 = uVar36;
          local_2a80 = uVar29;
          uStack_2a78 = uVar30;
          uStack_2a70 = uVar31;
          uStack_2a68 = uVar32;
          local_2a60 = uVar25;
          uStack_2a58 = uVar26;
          uStack_2a50 = uVar27;
          uStack_2a48 = uVar28;
          local_2a40 = uVar21;
          uStack_2a38 = uVar22;
          uStack_2a30 = uVar23;
          uStack_2a28 = uVar24;
          local_2a00 = uVar17;
          uStack_29f8 = uVar18;
          uStack_29f0 = uVar19;
          uStack_29e8 = uVar20;
          local_29e0 = uVar13;
          uStack_29d8 = uVar14;
          uStack_29d0 = uVar15;
          uStack_29c8 = uVar16;
          local_29c0 = uVar9;
          uStack_29b8 = uVar10;
          uStack_29b0 = uVar11;
          uStack_29a8 = uVar12;
          local_22c0 = local_28f0;
          local_22a0 = local_28e8;
          local_2280 = local_28e0;
          local_1fe0 = local_2b60;
          uStack_1fd8 = uStack_2b58;
          uStack_1fd0 = uStack_2b50;
          uStack_1fc8 = uStack_2b48;
          local_1fa0 = local_2b40;
          uStack_1f98 = uStack_2b38;
          uStack_1f90 = uStack_2b30;
          uStack_1f88 = uStack_2b28;
          local_1f60 = local_2b20;
          uStack_1f58 = uStack_2b18;
          uStack_1f50 = uStack_2b10;
          uStack_1f48 = uStack_2b08;
          local_1cc0 = local_2aa0;
          uStack_1cb8 = uStack_2a98;
          uStack_1cb0 = uStack_2a90;
          uStack_1ca8 = uStack_2a88;
          local_1c80 = local_2a20;
          uStack_1c78 = uStack_2a18;
          uStack_1c70 = uStack_2a10;
          uStack_1c68 = uStack_2a08;
          local_1c60 = local_c40._0_8_;
          uStack_1c58 = local_c40._8_8_;
          uStack_1c50 = local_c40._16_8_;
          uStack_1c48 = local_c40._24_8_;
          local_1c40 = local_29a0;
          uStack_1c38 = uStack_2998;
          uStack_1c30 = uStack_2990;
          uStack_1c28 = uStack_2988;
          local_14e0 = local_b80._0_8_;
          uStack_14d8 = local_b80._8_8_;
          uStack_14d0 = local_b80._16_8_;
          uStack_14c8 = local_b80._24_8_;
          local_13c0 = local_bc0._0_8_;
          uStack_13b8 = local_bc0._8_8_;
          uStack_13b0 = local_bc0._16_8_;
          uStack_13a8 = local_bc0._24_8_;
          local_12a0 = local_c00._0_8_;
          uStack_1298 = local_c00._8_8_;
          uStack_1290 = local_c00._16_8_;
          uStack_1288 = local_c00._24_8_;
          local_c40 = auVar69;
          local_c20 = local_1e44;
          local_c1c = local_1e44;
          local_c18 = local_1e44;
          local_c14 = local_1e44;
          local_c10 = local_1e44;
          local_c0c = local_1e44;
          local_c08 = local_1e44;
          local_c04 = local_1e44;
          local_c00 = auVar70;
          local_be0 = local_1e48;
          local_bdc = local_1e48;
          local_bd8 = local_1e48;
          local_bd4 = local_1e48;
          local_bd0 = local_1e48;
          local_bcc = local_1e48;
          local_bc8 = local_1e48;
          local_bc4 = local_1e48;
          local_bc0 = auVar71;
          local_ba0 = local_1e4c;
          local_b9c = local_1e4c;
          local_b98 = local_1e4c;
          local_b94 = local_1e4c;
          local_b90 = local_1e4c;
          local_b8c = local_1e4c;
          local_b88 = local_1e4c;
          local_b84 = local_1e4c;
          local_b80 = auVar72;
          local_b60 = local_1e50;
          local_b5c = local_1e50;
          local_b58 = local_1e50;
          local_b54 = local_1e50;
          local_b50 = local_1e50;
          local_b4c = local_1e50;
          local_b48 = local_1e50;
          local_b44 = local_1e50;
          fStack_6c4 = fStack_1264;
          fStack_684 = fStack_12c4;
          fStack_644 = fStack_1324;
          fStack_604 = fStack_1384;
          fStack_5c4 = fStack_13e4;
          fStack_584 = fStack_1444;
          fStack_544 = fStack_14a4;
          fStack_504 = fStack_1504;
          fStack_4c4 = fStack_1564;
        }
      }
      else {
        local_219c = local_2504 + -1;
        local_2198 = local_2378;
        local_2b68 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_219c * local_2378[2];
        local_21a8 = local_2378;
        local_2b70 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_2504 * local_2378[2];
        local_21bc = local_2504 + 1;
        local_21b8 = local_2378;
        local_2b78 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_21bc * local_2378[2];
        local_21cc = local_2504 + 2;
        local_21c8 = local_2378;
        local_2b80 = *local_2378 +
                     (long)*(int *)((long)local_2378 + 0x2c) * (long)local_21cc * local_2378[2];
        local_2b88 = local_2388;
        local_2b90 = local_24e0;
        local_2b98 = local_24e8;
        local_2ba0 = local_24f0;
        local_2ba8 = local_24f8;
        for (local_2bac = 0; local_21ac = local_2504, local_2bac < local_23a4;
            local_2bac = local_2bac + 1) {
          local_2bb0 = *(int *)(local_2390 + (long)local_2bac * 4) << 3;
          local_2bb8 = (undefined8 *)(local_2b68 + (long)local_2bb0 * 4);
          local_2bc0 = (undefined8 *)(local_2b70 + (long)local_2bb0 * 4);
          local_2bc8 = (undefined8 *)(local_2b78 + (long)local_2bb0 * 4);
          local_2bd0 = (undefined8 *)(local_2b80 + (long)local_2bb0 * 4);
          local_1e54 = *local_2b88;
          auVar1 = vinsertps_avx(ZEXT416(local_1e54),ZEXT416(local_1e54),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e54),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e54),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_1e54),ZEXT416(local_1e54),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e54),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e54),0x30);
          auVar73._16_16_ = auVar1;
          auVar73._0_16_ = auVar2;
          local_b40._0_8_ = auVar2._0_8_;
          local_b40._8_8_ = auVar2._8_8_;
          local_b40._16_8_ = auVar1._0_8_;
          local_b40._24_8_ = auVar1._8_8_;
          local_2c00 = local_b40._0_8_;
          uStack_2bf8 = local_b40._8_8_;
          uStack_2bf0 = local_b40._16_8_;
          uStack_2be8 = local_b40._24_8_;
          local_1e58 = local_2b88[1];
          auVar3 = vinsertps_avx(ZEXT416(local_1e58),ZEXT416(local_1e58),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e58),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e58),0x30);
          auVar4 = vinsertps_avx(ZEXT416(local_1e58),ZEXT416(local_1e58),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e58),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e58),0x30);
          auVar74._16_16_ = auVar3;
          auVar74._0_16_ = auVar4;
          local_b00._0_8_ = auVar4._0_8_;
          local_b00._8_8_ = auVar4._8_8_;
          local_b00._16_8_ = auVar3._0_8_;
          local_b00._24_8_ = auVar3._8_8_;
          local_2c20 = local_b00._0_8_;
          uStack_2c18 = local_b00._8_8_;
          uStack_2c10 = local_b00._16_8_;
          uStack_2c08 = local_b00._24_8_;
          local_1e5c = local_2b88[2];
          auVar5 = vinsertps_avx(ZEXT416(local_1e5c),ZEXT416(local_1e5c),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e5c),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e5c),0x30);
          auVar6 = vinsertps_avx(ZEXT416(local_1e5c),ZEXT416(local_1e5c),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e5c),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e5c),0x30);
          auVar75._16_16_ = auVar5;
          auVar75._0_16_ = auVar6;
          local_ac0._0_8_ = auVar6._0_8_;
          local_ac0._8_8_ = auVar6._8_8_;
          local_ac0._16_8_ = auVar5._0_8_;
          local_ac0._24_8_ = auVar5._8_8_;
          local_2c40 = local_ac0._0_8_;
          uStack_2c38 = local_ac0._8_8_;
          uStack_2c30 = local_ac0._16_8_;
          uStack_2c28 = local_ac0._24_8_;
          local_1e60 = local_2b88[3];
          auVar7 = vinsertps_avx(ZEXT416(local_1e60),ZEXT416(local_1e60),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e60),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e60),0x30);
          auVar8 = vinsertps_avx(ZEXT416(local_1e60),ZEXT416(local_1e60),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e60),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e60),0x30);
          auVar76._16_16_ = auVar7;
          auVar76._0_16_ = auVar8;
          local_a80._0_8_ = auVar8._0_8_;
          local_a80._8_8_ = auVar8._8_8_;
          local_a80._16_8_ = auVar7._0_8_;
          local_a80._24_8_ = auVar7._8_8_;
          local_2c60 = local_a80._0_8_;
          uStack_2c58 = local_a80._8_8_;
          uStack_2c50 = local_a80._16_8_;
          uStack_2c48 = local_a80._24_8_;
          local_22d8 = local_2bb8 + -4;
          local_2c80 = *local_22d8;
          uStack_2c78 = local_2bb8[-3];
          uStack_2c70 = local_2bb8[-2];
          uStack_2c68 = local_2bb8[-1];
          uVar9 = *local_2bb8;
          uVar10 = local_2bb8[1];
          uVar11 = local_2bb8[2];
          uVar12 = local_2bb8[3];
          local_22e8 = local_2bb8 + 4;
          uVar13 = *local_22e8;
          uVar14 = local_2bb8[5];
          uVar15 = local_2bb8[6];
          uVar16 = local_2bb8[7];
          local_22f0 = local_2bb8 + 8;
          uVar17 = *local_22f0;
          uVar18 = local_2bb8[9];
          uVar19 = local_2bb8[10];
          uVar20 = local_2bb8[0xb];
          local_22f8 = local_2bc0 + -4;
          local_2d00 = *local_22f8;
          uStack_2cf8 = local_2bc0[-3];
          uStack_2cf0 = local_2bc0[-2];
          uStack_2ce8 = local_2bc0[-1];
          uVar21 = *local_2bc0;
          uVar22 = local_2bc0[1];
          uVar23 = local_2bc0[2];
          uVar24 = local_2bc0[3];
          local_2308 = local_2bc0 + 4;
          uVar25 = *local_2308;
          uVar26 = local_2bc0[5];
          uVar27 = local_2bc0[6];
          uVar28 = local_2bc0[7];
          local_2310 = local_2bc0 + 8;
          uVar29 = *local_2310;
          uVar30 = local_2bc0[9];
          uVar31 = local_2bc0[10];
          uVar32 = local_2bc0[0xb];
          local_2318 = local_2bc8 + -4;
          local_2d80 = *local_2318;
          uStack_2d78 = local_2bc8[-3];
          uStack_2d70 = local_2bc8[-2];
          uStack_2d68 = local_2bc8[-1];
          uVar33 = *local_2bc8;
          uVar34 = local_2bc8[1];
          uVar35 = local_2bc8[2];
          uVar36 = local_2bc8[3];
          local_2328 = local_2bc8 + 4;
          uVar37 = *local_2328;
          uVar38 = local_2bc8[5];
          uVar39 = local_2bc8[6];
          uVar40 = local_2bc8[7];
          local_2330 = local_2bc8 + 8;
          uVar41 = *local_2330;
          uVar42 = local_2bc8[9];
          uVar43 = local_2bc8[10];
          uVar44 = local_2bc8[0xb];
          local_2338 = local_2bd0 + -4;
          local_2e00 = *local_2338;
          uStack_2df8 = local_2bd0[-3];
          uStack_2df0 = local_2bd0[-2];
          uStack_2de8 = local_2bd0[-1];
          uVar45 = *local_2bd0;
          uVar46 = local_2bd0[1];
          uVar47 = local_2bd0[2];
          uVar48 = local_2bd0[3];
          local_2348 = local_2bd0 + 4;
          uVar49 = *local_2348;
          uVar50 = local_2bd0[5];
          uVar51 = local_2bd0[6];
          uVar52 = local_2bd0[7];
          local_2350 = local_2bd0 + 8;
          uVar53 = *local_2350;
          uVar54 = local_2bd0[9];
          uVar55 = local_2bd0[10];
          uVar56 = local_2bd0[0xb];
          local_1d00._0_4_ = (float)local_2c80;
          local_1d00._4_4_ = (float)((ulong)local_2c80 >> 0x20);
          uStack_1cf8._0_4_ = (float)uStack_2c78;
          uStack_1cf8._4_4_ = (float)((ulong)uStack_2c78 >> 0x20);
          uStack_1cf0._0_4_ = (float)uStack_2c70;
          uStack_1cf0._4_4_ = (float)((ulong)uStack_2c70 >> 0x20);
          uStack_1ce8._0_4_ = (float)uStack_2c68;
          uStack_1ce8._4_4_ = (float)((ulong)uStack_2c68 >> 0x20);
          local_1d20._0_4_ = auVar2._0_4_;
          local_1d20._4_4_ = auVar2._4_4_;
          uStack_1d18._0_4_ = auVar2._8_4_;
          uStack_1d18._4_4_ = auVar2._12_4_;
          uStack_1d10._0_4_ = auVar1._0_4_;
          uStack_1d10._4_4_ = auVar1._4_4_;
          uStack_1d08._0_4_ = auVar1._8_4_;
          local_2e80 = CONCAT44(local_1d00._4_4_ * local_1d20._4_4_,
                                (float)local_1d00 * (float)local_1d20);
          uStack_2e78 = CONCAT44(uStack_1cf8._4_4_ * uStack_1d18._4_4_,
                                 (float)uStack_1cf8 * (float)uStack_1d18);
          uStack_2e70 = CONCAT44(uStack_1cf0._4_4_ * uStack_1d10._4_4_,
                                 (float)uStack_1cf0 * (float)uStack_1d10);
          uStack_2e68 = CONCAT44(uStack_1ce8._4_4_,(float)uStack_1ce8 * (float)uStack_1d08);
          local_1d60 = local_b40._0_8_;
          uStack_1d58 = local_b40._8_8_;
          uStack_1d50 = local_b40._16_8_;
          uStack_1d48 = local_b40._24_8_;
          local_1d40._0_4_ = (float)local_2d00;
          local_1d40._4_4_ = (float)((ulong)local_2d00 >> 0x20);
          uStack_1d38._0_4_ = (float)uStack_2cf8;
          uStack_1d38._4_4_ = (float)((ulong)uStack_2cf8 >> 0x20);
          uStack_1d30._0_4_ = (float)uStack_2cf0;
          uStack_1d30._4_4_ = (float)((ulong)uStack_2cf0 >> 0x20);
          uStack_1d28._0_4_ = (float)uStack_2ce8;
          uStack_1d28._4_4_ = (float)((ulong)uStack_2ce8 >> 0x20);
          local_2ea0 = CONCAT44(local_1d40._4_4_ * local_1d20._4_4_,
                                (float)local_1d40 * (float)local_1d20);
          uStack_2e98 = CONCAT44(uStack_1d38._4_4_ * uStack_1d18._4_4_,
                                 (float)uStack_1d38 * (float)uStack_1d18);
          uStack_2e90 = CONCAT44(uStack_1d30._4_4_ * uStack_1d10._4_4_,
                                 (float)uStack_1d30 * (float)uStack_1d10);
          uStack_2e88 = CONCAT44(uStack_1d28._4_4_,(float)uStack_1d28 * (float)uStack_1d08);
          local_1da0 = local_b40._0_8_;
          uStack_1d98 = local_b40._8_8_;
          uStack_1d90 = local_b40._16_8_;
          uStack_1d88 = local_b40._24_8_;
          local_1d80._0_4_ = (float)local_2d80;
          local_1d80._4_4_ = (float)((ulong)local_2d80 >> 0x20);
          uStack_1d78._0_4_ = (float)uStack_2d78;
          uStack_1d78._4_4_ = (float)((ulong)uStack_2d78 >> 0x20);
          uStack_1d70._0_4_ = (float)uStack_2d70;
          uStack_1d70._4_4_ = (float)((ulong)uStack_2d70 >> 0x20);
          uStack_1d68._0_4_ = (float)uStack_2d68;
          uStack_1d68._4_4_ = (float)((ulong)uStack_2d68 >> 0x20);
          local_2ec0 = CONCAT44(local_1d80._4_4_ * local_1d20._4_4_,
                                (float)local_1d80 * (float)local_1d20);
          uStack_2eb8 = CONCAT44(uStack_1d78._4_4_ * uStack_1d18._4_4_,
                                 (float)uStack_1d78 * (float)uStack_1d18);
          uStack_2eb0 = CONCAT44(uStack_1d70._4_4_ * uStack_1d10._4_4_,
                                 (float)uStack_1d70 * (float)uStack_1d10);
          uStack_2ea8 = CONCAT44(uStack_1d68._4_4_,(float)uStack_1d68 * (float)uStack_1d08);
          local_1de0 = local_b40._0_8_;
          uStack_1dd8 = local_b40._8_8_;
          uStack_1dd0 = local_b40._16_8_;
          uStack_1dc8 = local_b40._24_8_;
          local_1dc0._0_4_ = (float)local_2e00;
          local_1dc0._4_4_ = (float)((ulong)local_2e00 >> 0x20);
          uStack_1db8._0_4_ = (float)uStack_2df8;
          uStack_1db8._4_4_ = (float)((ulong)uStack_2df8 >> 0x20);
          uStack_1db0._0_4_ = (float)uStack_2df0;
          uStack_1db0._4_4_ = (float)((ulong)uStack_2df0 >> 0x20);
          uStack_1da8._0_4_ = (float)uStack_2de8;
          uStack_1da8._4_4_ = (float)((ulong)uStack_2de8 >> 0x20);
          local_2ee0 = CONCAT44(local_1dc0._4_4_ * local_1d20._4_4_,
                                (float)local_1dc0 * (float)local_1d20);
          uStack_2ed8 = CONCAT44(uStack_1db8._4_4_ * uStack_1d18._4_4_,
                                 (float)uStack_1db8 * (float)uStack_1d18);
          uStack_2ed0 = CONCAT44(uStack_1db0._4_4_ * uStack_1d10._4_4_,
                                 (float)uStack_1db0 * (float)uStack_1d10);
          uStack_2ec8 = CONCAT44(uStack_1da8._4_4_,(float)uStack_1da8 * (float)uStack_1d08);
          local_1608 = &local_2ca0;
          local_1610 = &local_2c20;
          local_1618 = &local_2e80;
          local_2ca0._0_4_ = (float)uVar9;
          local_15e0 = (float)local_2ca0;
          local_2ca0._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_15dc = local_2ca0._4_4_;
          uStack_2c98._0_4_ = (float)uVar10;
          fStack_15d8 = (float)uStack_2c98;
          uStack_2c98._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_15d4 = uStack_2c98._4_4_;
          uStack_2c90._0_4_ = (float)uVar11;
          fStack_15d0 = (float)uStack_2c90;
          uStack_2c90._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_15cc = uStack_2c90._4_4_;
          uStack_2c88._0_4_ = (float)uVar12;
          fStack_15c8 = (float)uStack_2c88;
          uStack_2c88._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_15c4 = uStack_2c88._4_4_;
          local_1600._0_4_ = auVar4._0_4_;
          local_1600._4_4_ = auVar4._4_4_;
          uStack_15f8._0_4_ = auVar4._8_4_;
          uStack_15f8._4_4_ = auVar4._12_4_;
          uStack_15f0._0_4_ = auVar3._0_4_;
          uStack_15f0._4_4_ = auVar3._4_4_;
          uStack_15e8._0_4_ = auVar3._8_4_;
          local_4a0 = (float)local_2ca0 * (float)local_1600;
          fStack_49c = local_2ca0._4_4_ * local_1600._4_4_;
          fStack_498 = (float)uStack_2c98 * (float)uStack_15f8;
          fStack_494 = uStack_2c98._4_4_ * uStack_15f8._4_4_;
          fStack_490 = (float)uStack_2c90 * (float)uStack_15f0;
          fStack_48c = uStack_2c90._4_4_ * uStack_15f0._4_4_;
          fStack_488 = (float)uStack_2c88 * (float)uStack_15e8;
          local_4c0 = local_2e80;
          uStack_4b8 = uStack_2e78;
          uStack_4b0 = uStack_2e70;
          uStack_4a8 = uStack_2e68;
          fVar60 = local_4a0 + (float)local_1d00 * (float)local_1d20;
          fVar88 = fStack_49c + local_1d00._4_4_ * local_1d20._4_4_;
          fVar85 = fStack_498 + (float)uStack_1cf8 * (float)uStack_1d18;
          fVar98 = fStack_494 + uStack_1cf8._4_4_ * uStack_1d18._4_4_;
          fVar92 = fStack_490 + (float)uStack_1cf0 * (float)uStack_1d10;
          fVar102 = fStack_48c + uStack_1cf0._4_4_ * uStack_1d10._4_4_;
          fVar103 = fStack_488 + (float)uStack_1ce8 * (float)uStack_1d08;
          local_3c0 = CONCAT44(fVar88,fVar60);
          uStack_3b8 = CONCAT44(fVar98,fVar85);
          uStack_3b0 = CONCAT44(fVar102,fVar92);
          uStack_3a8 = CONCAT44(uStack_2c88._4_4_ + uStack_1ce8._4_4_,fVar103);
          local_1668 = &local_2d20;
          local_1670 = &local_2c20;
          local_1678 = &local_2ea0;
          local_2d20._0_4_ = (float)uVar21;
          local_1640 = (float)local_2d20;
          local_2d20._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_163c = local_2d20._4_4_;
          uStack_2d18._0_4_ = (float)uVar22;
          fStack_1638 = (float)uStack_2d18;
          uStack_2d18._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_1634 = uStack_2d18._4_4_;
          uStack_2d10._0_4_ = (float)uVar23;
          fStack_1630 = (float)uStack_2d10;
          uStack_2d10._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_162c = uStack_2d10._4_4_;
          uStack_2d08._0_4_ = (float)uVar24;
          fStack_1628 = (float)uStack_2d08;
          uStack_2d08._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_1624 = uStack_2d08._4_4_;
          local_1660 = local_b00._0_8_;
          uStack_1658 = local_b00._8_8_;
          uStack_1650 = local_b00._16_8_;
          uStack_1648 = local_b00._24_8_;
          local_460 = (float)local_2d20 * (float)local_1600;
          fStack_45c = local_2d20._4_4_ * local_1600._4_4_;
          fStack_458 = (float)uStack_2d18 * (float)uStack_15f8;
          fStack_454 = uStack_2d18._4_4_ * uStack_15f8._4_4_;
          fStack_450 = (float)uStack_2d10 * (float)uStack_15f0;
          fStack_44c = uStack_2d10._4_4_ * uStack_15f0._4_4_;
          fStack_448 = (float)uStack_2d08 * (float)uStack_15e8;
          local_480 = local_2ea0;
          uStack_478 = uStack_2e98;
          uStack_470 = uStack_2e90;
          uStack_468 = uStack_2e88;
          fVar81 = local_460 + (float)local_1d40 * (float)local_1d20;
          fVar97 = fStack_45c + local_1d40._4_4_ * local_1d20._4_4_;
          fVar86 = fStack_458 + (float)uStack_1d38 * (float)uStack_1d18;
          fVar99 = fStack_454 + uStack_1d38._4_4_ * uStack_1d18._4_4_;
          fVar93 = fStack_450 + (float)uStack_1d30 * (float)uStack_1d10;
          fVar94 = fStack_44c + uStack_1d30._4_4_ * uStack_1d10._4_4_;
          fVar104 = fStack_448 + (float)uStack_1d28 * (float)uStack_1d08;
          local_380 = CONCAT44(fVar97,fVar81);
          uStack_378 = CONCAT44(fVar99,fVar86);
          uStack_370 = CONCAT44(fVar94,fVar93);
          uStack_368 = CONCAT44(uStack_2d08._4_4_ + uStack_1d28._4_4_,fVar104);
          local_16c8 = &local_2da0;
          local_16d0 = &local_2c20;
          local_16d8 = &local_2ec0;
          local_2da0._0_4_ = (float)uVar33;
          local_16a0 = (float)local_2da0;
          local_2da0._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_169c = local_2da0._4_4_;
          uStack_2d98._0_4_ = (float)uVar34;
          fStack_1698 = (float)uStack_2d98;
          uStack_2d98._4_4_ = (float)((ulong)uVar34 >> 0x20);
          fStack_1694 = uStack_2d98._4_4_;
          uStack_2d90._0_4_ = (float)uVar35;
          fStack_1690 = (float)uStack_2d90;
          uStack_2d90._4_4_ = (float)((ulong)uVar35 >> 0x20);
          fStack_168c = uStack_2d90._4_4_;
          uStack_2d88._0_4_ = (float)uVar36;
          fStack_1688 = (float)uStack_2d88;
          uStack_2d88._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_1684 = uStack_2d88._4_4_;
          local_16c0 = local_b00._0_8_;
          uStack_16b8 = local_b00._8_8_;
          uStack_16b0 = local_b00._16_8_;
          uStack_16a8 = local_b00._24_8_;
          local_420 = (float)local_2da0 * (float)local_1600;
          fStack_41c = local_2da0._4_4_ * local_1600._4_4_;
          fStack_418 = (float)uStack_2d98 * (float)uStack_15f8;
          fStack_414 = uStack_2d98._4_4_ * uStack_15f8._4_4_;
          fStack_410 = (float)uStack_2d90 * (float)uStack_15f0;
          fStack_40c = uStack_2d90._4_4_ * uStack_15f0._4_4_;
          fStack_408 = (float)uStack_2d88 * (float)uStack_15e8;
          local_440 = local_2ec0;
          uStack_438 = uStack_2eb8;
          uStack_430 = uStack_2eb0;
          uStack_428 = uStack_2ea8;
          fVar82 = local_420 + (float)local_1d80 * (float)local_1d20;
          fVar107 = fStack_41c + local_1d80._4_4_ * local_1d20._4_4_;
          fVar89 = fStack_418 + (float)uStack_1d78 * (float)uStack_1d18;
          fVar87 = fStack_414 + uStack_1d78._4_4_ * uStack_1d18._4_4_;
          fVar100 = fStack_410 + (float)uStack_1d70 * (float)uStack_1d10;
          fVar95 = fStack_40c + uStack_1d70._4_4_ * uStack_1d10._4_4_;
          fVar105 = fStack_408 + (float)uStack_1d68 * (float)uStack_1d08;
          local_340 = CONCAT44(fVar107,fVar82);
          uStack_338 = CONCAT44(fVar87,fVar89);
          uStack_330 = CONCAT44(fVar95,fVar100);
          uStack_328 = CONCAT44(uStack_2d88._4_4_ + uStack_1d68._4_4_,fVar105);
          local_1728 = &local_2e20;
          local_1730 = &local_2c20;
          local_1738 = &local_2ee0;
          local_2e20._0_4_ = (float)uVar45;
          local_1700 = (float)local_2e20;
          local_2e20._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_16fc = local_2e20._4_4_;
          uStack_2e18._0_4_ = (float)uVar46;
          fStack_16f8 = (float)uStack_2e18;
          uStack_2e18._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_16f4 = uStack_2e18._4_4_;
          uStack_2e10._0_4_ = (float)uVar47;
          fStack_16f0 = (float)uStack_2e10;
          uStack_2e10._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_16ec = uStack_2e10._4_4_;
          uStack_2e08._0_4_ = (float)uVar48;
          fStack_16e8 = (float)uStack_2e08;
          uStack_2e08._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_16e4 = uStack_2e08._4_4_;
          local_1720 = local_b00._0_8_;
          uStack_1718 = local_b00._8_8_;
          uStack_1710 = local_b00._16_8_;
          uStack_1708 = local_b00._24_8_;
          local_3e0 = (float)local_2e20 * (float)local_1600;
          fStack_3dc = local_2e20._4_4_ * local_1600._4_4_;
          fStack_3d8 = (float)uStack_2e18 * (float)uStack_15f8;
          fStack_3d4 = uStack_2e18._4_4_ * uStack_15f8._4_4_;
          fStack_3d0 = (float)uStack_2e10 * (float)uStack_15f0;
          fStack_3cc = uStack_2e10._4_4_ * uStack_15f0._4_4_;
          fStack_3c8 = (float)uStack_2e08 * (float)uStack_15e8;
          local_400 = local_2ee0;
          uStack_3f8 = uStack_2ed8;
          uStack_3f0 = uStack_2ed0;
          uStack_3e8 = uStack_2ec8;
          fVar84 = local_3e0 + (float)local_1dc0 * (float)local_1d20;
          fVar83 = fStack_3dc + local_1dc0._4_4_ * local_1d20._4_4_;
          fVar90 = fStack_3d8 + (float)uStack_1db8 * (float)uStack_1d18;
          fVar91 = fStack_3d4 + uStack_1db8._4_4_ * uStack_1d18._4_4_;
          fVar101 = fStack_3d0 + (float)uStack_1db0 * (float)uStack_1d10;
          fVar96 = fStack_3cc + uStack_1db0._4_4_ * uStack_1d10._4_4_;
          fVar106 = fStack_3c8 + (float)uStack_1da8 * (float)uStack_1d08;
          local_300 = CONCAT44(fVar83,fVar84);
          uStack_2f8 = CONCAT44(fVar91,fVar90);
          uStack_2f0 = CONCAT44(fVar96,fVar101);
          uStack_2e8 = CONCAT44(uStack_2e08._4_4_ + uStack_1da8._4_4_,fVar106);
          local_1788 = &local_2cc0;
          local_1790 = &local_2c40;
          local_1798 = &local_2e80;
          local_2cc0._0_4_ = (float)uVar13;
          local_1760 = (float)local_2cc0;
          local_2cc0._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_175c = local_2cc0._4_4_;
          uStack_2cb8._0_4_ = (float)uVar14;
          fStack_1758 = (float)uStack_2cb8;
          uStack_2cb8._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_1754 = uStack_2cb8._4_4_;
          uStack_2cb0._0_4_ = (float)uVar15;
          fStack_1750 = (float)uStack_2cb0;
          uStack_2cb0._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_174c = uStack_2cb0._4_4_;
          uStack_2ca8._0_4_ = (float)uVar16;
          fStack_1748 = (float)uStack_2ca8;
          uStack_2ca8._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_1744 = uStack_2ca8._4_4_;
          local_1780._0_4_ = auVar6._0_4_;
          local_1780._4_4_ = auVar6._4_4_;
          uStack_1778._0_4_ = auVar6._8_4_;
          uStack_1778._4_4_ = auVar6._12_4_;
          uStack_1770._0_4_ = auVar5._0_4_;
          uStack_1770._4_4_ = auVar5._4_4_;
          uStack_1768._0_4_ = auVar5._8_4_;
          local_3a0 = (float)local_2cc0 * (float)local_1780;
          fStack_39c = local_2cc0._4_4_ * local_1780._4_4_;
          fStack_398 = (float)uStack_2cb8 * (float)uStack_1778;
          fStack_394 = uStack_2cb8._4_4_ * uStack_1778._4_4_;
          fStack_390 = (float)uStack_2cb0 * (float)uStack_1770;
          fStack_38c = uStack_2cb0._4_4_ * uStack_1770._4_4_;
          fStack_388 = (float)uStack_2ca8 * (float)uStack_1768;
          fVar60 = local_3a0 + fVar60;
          fVar88 = fStack_39c + fVar88;
          fVar85 = fStack_398 + fVar85;
          fVar98 = fStack_394 + fVar98;
          fVar92 = fStack_390 + fVar92;
          fVar102 = fStack_38c + fVar102;
          fVar103 = fStack_388 + fVar103;
          uStack_2ca8._4_4_ = uStack_2ca8._4_4_ + uStack_2c88._4_4_ + uStack_1ce8._4_4_;
          local_2c0 = CONCAT44(fVar88,fVar60);
          uStack_2b8 = CONCAT44(fVar98,fVar85);
          uStack_2b0 = CONCAT44(fVar102,fVar92);
          uStack_2a8 = CONCAT44(uStack_2ca8._4_4_,fVar103);
          local_17e8 = &local_2d40;
          local_17f0 = &local_2c40;
          local_17f8 = &local_2ea0;
          local_2d40._0_4_ = (float)uVar25;
          local_17c0 = (float)local_2d40;
          local_2d40._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_17bc = local_2d40._4_4_;
          uStack_2d38._0_4_ = (float)uVar26;
          fStack_17b8 = (float)uStack_2d38;
          uStack_2d38._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_17b4 = uStack_2d38._4_4_;
          uStack_2d30._0_4_ = (float)uVar27;
          fStack_17b0 = (float)uStack_2d30;
          uStack_2d30._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_17ac = uStack_2d30._4_4_;
          uStack_2d28._0_4_ = (float)uVar28;
          fStack_17a8 = (float)uStack_2d28;
          uStack_2d28._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_17a4 = uStack_2d28._4_4_;
          local_17e0 = local_ac0._0_8_;
          uStack_17d8 = local_ac0._8_8_;
          uStack_17d0 = local_ac0._16_8_;
          uStack_17c8 = local_ac0._24_8_;
          local_360 = (float)local_2d40 * (float)local_1780;
          fStack_35c = local_2d40._4_4_ * local_1780._4_4_;
          fStack_358 = (float)uStack_2d38 * (float)uStack_1778;
          fStack_354 = uStack_2d38._4_4_ * uStack_1778._4_4_;
          fStack_350 = (float)uStack_2d30 * (float)uStack_1770;
          fStack_34c = uStack_2d30._4_4_ * uStack_1770._4_4_;
          fStack_348 = (float)uStack_2d28 * (float)uStack_1768;
          fVar81 = local_360 + fVar81;
          fVar97 = fStack_35c + fVar97;
          fVar86 = fStack_358 + fVar86;
          fVar99 = fStack_354 + fVar99;
          fVar93 = fStack_350 + fVar93;
          fVar94 = fStack_34c + fVar94;
          fVar104 = fStack_348 + fVar104;
          uStack_2d28._4_4_ = uStack_2d28._4_4_ + uStack_2d08._4_4_ + uStack_1d28._4_4_;
          local_280 = CONCAT44(fVar97,fVar81);
          uStack_278 = CONCAT44(fVar99,fVar86);
          uStack_270 = CONCAT44(fVar94,fVar93);
          uStack_268 = CONCAT44(uStack_2d28._4_4_,fVar104);
          local_1848 = &local_2dc0;
          local_1850 = &local_2c40;
          local_1858 = &local_2ec0;
          local_2dc0._0_4_ = (float)uVar37;
          local_1820 = (float)local_2dc0;
          local_2dc0._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_181c = local_2dc0._4_4_;
          uStack_2db8._0_4_ = (float)uVar38;
          fStack_1818 = (float)uStack_2db8;
          uStack_2db8._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_1814 = uStack_2db8._4_4_;
          uStack_2db0._0_4_ = (float)uVar39;
          fStack_1810 = (float)uStack_2db0;
          uStack_2db0._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_180c = uStack_2db0._4_4_;
          uStack_2da8._0_4_ = (float)uVar40;
          fStack_1808 = (float)uStack_2da8;
          uStack_2da8._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_1804 = uStack_2da8._4_4_;
          local_1840 = local_ac0._0_8_;
          uStack_1838 = local_ac0._8_8_;
          uStack_1830 = local_ac0._16_8_;
          uStack_1828 = local_ac0._24_8_;
          local_320 = (float)local_2dc0 * (float)local_1780;
          fStack_31c = local_2dc0._4_4_ * local_1780._4_4_;
          fStack_318 = (float)uStack_2db8 * (float)uStack_1778;
          fStack_314 = uStack_2db8._4_4_ * uStack_1778._4_4_;
          fStack_310 = (float)uStack_2db0 * (float)uStack_1770;
          fStack_30c = uStack_2db0._4_4_ * uStack_1770._4_4_;
          fStack_308 = (float)uStack_2da8 * (float)uStack_1768;
          fVar82 = local_320 + fVar82;
          fVar107 = fStack_31c + fVar107;
          fVar89 = fStack_318 + fVar89;
          fVar87 = fStack_314 + fVar87;
          fVar100 = fStack_310 + fVar100;
          fVar95 = fStack_30c + fVar95;
          fVar105 = fStack_308 + fVar105;
          uStack_2da8._4_4_ = uStack_2da8._4_4_ + uStack_2d88._4_4_ + uStack_1d68._4_4_;
          local_240 = CONCAT44(fVar107,fVar82);
          uStack_238 = CONCAT44(fVar87,fVar89);
          uStack_230 = CONCAT44(fVar95,fVar100);
          uStack_228 = CONCAT44(uStack_2da8._4_4_,fVar105);
          local_18a8 = &local_2e40;
          local_18b0 = &local_2c40;
          local_18b8 = &local_2ee0;
          local_2e40._0_4_ = (float)uVar49;
          local_1880 = (float)local_2e40;
          local_2e40._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_187c = local_2e40._4_4_;
          uStack_2e38._0_4_ = (float)uVar50;
          fStack_1878 = (float)uStack_2e38;
          uStack_2e38._4_4_ = (float)((ulong)uVar50 >> 0x20);
          fStack_1874 = uStack_2e38._4_4_;
          uStack_2e30._0_4_ = (float)uVar51;
          fStack_1870 = (float)uStack_2e30;
          uStack_2e30._4_4_ = (float)((ulong)uVar51 >> 0x20);
          fStack_186c = uStack_2e30._4_4_;
          uStack_2e28._0_4_ = (float)uVar52;
          fStack_1868 = (float)uStack_2e28;
          uStack_2e28._4_4_ = (float)((ulong)uVar52 >> 0x20);
          fStack_1864 = uStack_2e28._4_4_;
          local_18a0 = local_ac0._0_8_;
          uStack_1898 = local_ac0._8_8_;
          uStack_1890 = local_ac0._16_8_;
          uStack_1888 = local_ac0._24_8_;
          local_2e0 = (float)local_2e40 * (float)local_1780;
          fStack_2dc = local_2e40._4_4_ * local_1780._4_4_;
          fStack_2d8 = (float)uStack_2e38 * (float)uStack_1778;
          fStack_2d4 = uStack_2e38._4_4_ * uStack_1778._4_4_;
          fStack_2d0 = (float)uStack_2e30 * (float)uStack_1770;
          fStack_2cc = uStack_2e30._4_4_ * uStack_1770._4_4_;
          fStack_2c8 = (float)uStack_2e28 * (float)uStack_1768;
          fVar84 = local_2e0 + fVar84;
          fVar83 = fStack_2dc + fVar83;
          fVar90 = fStack_2d8 + fVar90;
          fVar91 = fStack_2d4 + fVar91;
          fVar101 = fStack_2d0 + fVar101;
          fVar96 = fStack_2cc + fVar96;
          fVar106 = fStack_2c8 + fVar106;
          uStack_2e28._4_4_ = uStack_2e28._4_4_ + uStack_2e08._4_4_ + uStack_1da8._4_4_;
          local_200 = CONCAT44(fVar83,fVar84);
          uStack_1f8 = CONCAT44(fVar91,fVar90);
          uStack_1f0 = CONCAT44(fVar96,fVar101);
          uStack_1e8 = CONCAT44(uStack_2e28._4_4_,fVar106);
          local_1908 = &local_2ce0;
          local_1910 = &local_2c60;
          local_1918 = &local_2e80;
          local_2ce0._0_4_ = (float)uVar17;
          local_18e0 = (float)local_2ce0;
          local_2ce0._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_18dc = local_2ce0._4_4_;
          uStack_2cd8._0_4_ = (float)uVar18;
          fStack_18d8 = (float)uStack_2cd8;
          uStack_2cd8._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_18d4 = uStack_2cd8._4_4_;
          uStack_2cd0._0_4_ = (float)uVar19;
          fStack_18d0 = (float)uStack_2cd0;
          uStack_2cd0._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_18cc = uStack_2cd0._4_4_;
          uStack_2cc8._0_4_ = (float)uVar20;
          fStack_18c8 = (float)uStack_2cc8;
          uStack_2cc8._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_18c4 = uStack_2cc8._4_4_;
          local_1900._0_4_ = auVar8._0_4_;
          local_1900._4_4_ = auVar8._4_4_;
          uStack_18f8._0_4_ = auVar8._8_4_;
          uStack_18f8._4_4_ = auVar8._12_4_;
          uStack_18f0._0_4_ = auVar7._0_4_;
          uStack_18f0._4_4_ = auVar7._4_4_;
          uStack_18e8._0_4_ = auVar7._8_4_;
          local_2a0 = (float)local_2ce0 * (float)local_1900;
          fStack_29c = local_2ce0._4_4_ * local_1900._4_4_;
          fStack_298 = (float)uStack_2cd8 * (float)uStack_18f8;
          fStack_294 = uStack_2cd8._4_4_ * uStack_18f8._4_4_;
          fStack_290 = (float)uStack_2cd0 * (float)uStack_18f0;
          fStack_28c = uStack_2cd0._4_4_ * uStack_18f0._4_4_;
          fStack_288 = (float)uStack_2cc8 * (float)uStack_18e8;
          local_2e80 = CONCAT44(fStack_29c + fVar88,local_2a0 + fVar60);
          uStack_2e78 = CONCAT44(fStack_294 + fVar98,fStack_298 + fVar85);
          uStack_2e70 = CONCAT44(fStack_28c + fVar102,fStack_290 + fVar92);
          uStack_2e68 = CONCAT44(uStack_2cc8._4_4_ + uStack_2ca8._4_4_,fStack_288 + fVar103);
          local_1968 = &local_2d60;
          local_1970 = &local_2c60;
          local_1978 = &local_2ea0;
          local_2d60._0_4_ = (float)uVar29;
          local_1940 = (float)local_2d60;
          local_2d60._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_193c = local_2d60._4_4_;
          uStack_2d58._0_4_ = (float)uVar30;
          fStack_1938 = (float)uStack_2d58;
          uStack_2d58._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_1934 = uStack_2d58._4_4_;
          uStack_2d50._0_4_ = (float)uVar31;
          fStack_1930 = (float)uStack_2d50;
          uStack_2d50._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_192c = uStack_2d50._4_4_;
          uStack_2d48._0_4_ = (float)uVar32;
          fStack_1928 = (float)uStack_2d48;
          uStack_2d48._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_1924 = uStack_2d48._4_4_;
          local_1960 = local_a80._0_8_;
          uStack_1958 = local_a80._8_8_;
          uStack_1950 = local_a80._16_8_;
          uStack_1948 = local_a80._24_8_;
          local_260 = (float)local_2d60 * (float)local_1900;
          fStack_25c = local_2d60._4_4_ * local_1900._4_4_;
          fStack_258 = (float)uStack_2d58 * (float)uStack_18f8;
          fStack_254 = uStack_2d58._4_4_ * uStack_18f8._4_4_;
          fStack_250 = (float)uStack_2d50 * (float)uStack_18f0;
          fStack_24c = uStack_2d50._4_4_ * uStack_18f0._4_4_;
          fStack_248 = (float)uStack_2d48 * (float)uStack_18e8;
          local_2ea0 = CONCAT44(fStack_25c + fVar97,local_260 + fVar81);
          uStack_2e98 = CONCAT44(fStack_254 + fVar99,fStack_258 + fVar86);
          uStack_2e90 = CONCAT44(fStack_24c + fVar94,fStack_250 + fVar93);
          uStack_2e88 = CONCAT44(uStack_2d48._4_4_ + uStack_2d28._4_4_,fStack_248 + fVar104);
          local_19c8 = &local_2de0;
          local_19d0 = &local_2c60;
          local_19d8 = &local_2ec0;
          local_2de0._0_4_ = (float)uVar41;
          local_19a0 = (float)local_2de0;
          local_2de0._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_199c = local_2de0._4_4_;
          uStack_2dd8._0_4_ = (float)uVar42;
          fStack_1998 = (float)uStack_2dd8;
          uStack_2dd8._4_4_ = (float)((ulong)uVar42 >> 0x20);
          fStack_1994 = uStack_2dd8._4_4_;
          uStack_2dd0._0_4_ = (float)uVar43;
          fStack_1990 = (float)uStack_2dd0;
          uStack_2dd0._4_4_ = (float)((ulong)uVar43 >> 0x20);
          fStack_198c = uStack_2dd0._4_4_;
          uStack_2dc8._0_4_ = (float)uVar44;
          fStack_1988 = (float)uStack_2dc8;
          uStack_2dc8._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_1984 = uStack_2dc8._4_4_;
          local_19c0 = local_a80._0_8_;
          uStack_19b8 = local_a80._8_8_;
          uStack_19b0 = local_a80._16_8_;
          uStack_19a8 = local_a80._24_8_;
          local_220 = (float)local_2de0 * (float)local_1900;
          fStack_21c = local_2de0._4_4_ * local_1900._4_4_;
          fStack_218 = (float)uStack_2dd8 * (float)uStack_18f8;
          fStack_214 = uStack_2dd8._4_4_ * uStack_18f8._4_4_;
          fStack_210 = (float)uStack_2dd0 * (float)uStack_18f0;
          fStack_20c = uStack_2dd0._4_4_ * uStack_18f0._4_4_;
          fStack_208 = (float)uStack_2dc8 * (float)uStack_18e8;
          local_2ec0 = CONCAT44(fStack_21c + fVar107,local_220 + fVar82);
          uStack_2eb8 = CONCAT44(fStack_214 + fVar87,fStack_218 + fVar89);
          uStack_2eb0 = CONCAT44(fStack_20c + fVar95,fStack_210 + fVar100);
          uStack_2ea8 = CONCAT44(uStack_2dc8._4_4_ + uStack_2da8._4_4_,fStack_208 + fVar105);
          local_1a28 = &local_2e60;
          local_1a30 = &local_2c60;
          local_1a38 = &local_2ee0;
          local_2e60._0_4_ = (float)uVar53;
          local_1a00 = (float)local_2e60;
          local_2e60._4_4_ = (float)((ulong)uVar53 >> 0x20);
          fStack_19fc = local_2e60._4_4_;
          uStack_2e58._0_4_ = (float)uVar54;
          fStack_19f8 = (float)uStack_2e58;
          uStack_2e58._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_19f4 = uStack_2e58._4_4_;
          uStack_2e50._0_4_ = (float)uVar55;
          fStack_19f0 = (float)uStack_2e50;
          uStack_2e50._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_19ec = uStack_2e50._4_4_;
          uStack_2e48._0_4_ = (float)uVar56;
          fStack_19e8 = (float)uStack_2e48;
          uStack_2e48._4_4_ = (float)((ulong)uVar56 >> 0x20);
          fStack_19e4 = uStack_2e48._4_4_;
          local_1a20 = local_a80._0_8_;
          uStack_1a18 = local_a80._8_8_;
          uStack_1a10 = local_a80._16_8_;
          uStack_1a08 = local_a80._24_8_;
          local_1e0 = (float)local_2e60 * (float)local_1900;
          fStack_1dc = local_2e60._4_4_ * local_1900._4_4_;
          fStack_1d8 = (float)uStack_2e58 * (float)uStack_18f8;
          fStack_1d4 = uStack_2e58._4_4_ * uStack_18f8._4_4_;
          fStack_1d0 = (float)uStack_2e50 * (float)uStack_18f0;
          fStack_1cc = uStack_2e50._4_4_ * uStack_18f0._4_4_;
          fStack_1c8 = (float)uStack_2e48 * (float)uStack_18e8;
          local_2ee0 = CONCAT44(fStack_1dc + fVar83,local_1e0 + fVar84);
          uStack_2ed8 = CONCAT44(fStack_1d4 + fVar91,fStack_1d8 + fVar90);
          uStack_2ed0 = CONCAT44(fStack_1cc + fVar96,fStack_1d0 + fVar101);
          uStack_2ec8 = CONCAT44(uStack_2e48._4_4_ + uStack_2e28._4_4_,fStack_1c8 + fVar106);
          local_1fe8 = (undefined8 *)((long)local_24e0 + (long)(local_2bac << 3) * 4);
          *local_1fe8 = local_2e80;
          local_1fe8[1] = uStack_2e78;
          local_1fe8[2] = uStack_2e70;
          local_1fe8[3] = uStack_2e68;
          local_2028 = (undefined8 *)((long)local_24e8 + (long)(local_2bac << 3) * 4);
          *local_2028 = local_2ea0;
          local_2028[1] = uStack_2e98;
          local_2028[2] = uStack_2e90;
          local_2028[3] = uStack_2e88;
          local_2068 = (undefined8 *)((long)local_24f0 + (long)(local_2bac << 3) * 4);
          *local_2068 = local_2ec0;
          local_2068[1] = uStack_2eb8;
          local_2068[2] = uStack_2eb0;
          local_2068[3] = uStack_2ea8;
          local_20a8 = (undefined8 *)((long)local_24f8 + (long)(local_2bac << 3) * 4);
          *local_20a8 = local_2ee0;
          local_20a8[1] = uStack_2ed8;
          local_20a8[2] = uStack_2ed0;
          local_20a8[3] = uStack_2ec8;
          local_2b88 = local_2b88 + 4;
          local_2e60 = uVar53;
          uStack_2e58 = uVar54;
          uStack_2e50 = uVar55;
          uStack_2e48 = uVar56;
          local_2e40 = uVar49;
          uStack_2e38 = uVar50;
          uStack_2e30 = uVar51;
          uStack_2e28 = uVar52;
          local_2e20 = uVar45;
          uStack_2e18 = uVar46;
          uStack_2e10 = uVar47;
          uStack_2e08 = uVar48;
          local_2de0 = uVar41;
          uStack_2dd8 = uVar42;
          uStack_2dd0 = uVar43;
          uStack_2dc8 = uVar44;
          local_2dc0 = uVar37;
          uStack_2db8 = uVar38;
          uStack_2db0 = uVar39;
          uStack_2da8 = uVar40;
          local_2da0 = uVar33;
          uStack_2d98 = uVar34;
          uStack_2d90 = uVar35;
          uStack_2d88 = uVar36;
          local_2d60 = uVar29;
          uStack_2d58 = uVar30;
          uStack_2d50 = uVar31;
          uStack_2d48 = uVar32;
          local_2d40 = uVar25;
          uStack_2d38 = uVar26;
          uStack_2d30 = uVar27;
          uStack_2d28 = uVar28;
          local_2d20 = uVar21;
          uStack_2d18 = uVar22;
          uStack_2d10 = uVar23;
          uStack_2d08 = uVar24;
          local_2ce0 = uVar17;
          uStack_2cd8 = uVar18;
          uStack_2cd0 = uVar19;
          uStack_2cc8 = uVar20;
          local_2cc0 = uVar13;
          uStack_2cb8 = uVar14;
          uStack_2cb0 = uVar15;
          uStack_2ca8 = uVar16;
          local_2ca0 = uVar9;
          uStack_2c98 = uVar10;
          uStack_2c90 = uVar11;
          uStack_2c88 = uVar12;
          local_2340 = local_2bd0;
          local_2320 = local_2bc8;
          local_2300 = local_2bc0;
          local_22e0 = local_2bb8;
          local_20e0 = local_2ee0;
          uStack_20d8 = uStack_2ed8;
          uStack_20d0 = uStack_2ed0;
          uStack_20c8 = uStack_2ec8;
          local_20a0 = local_2ec0;
          uStack_2098 = uStack_2eb8;
          uStack_2090 = uStack_2eb0;
          uStack_2088 = uStack_2ea8;
          local_2060 = local_2ea0;
          uStack_2058 = uStack_2e98;
          uStack_2050 = uStack_2e90;
          uStack_2048 = uStack_2e88;
          local_2020 = local_2e80;
          uStack_2018 = uStack_2e78;
          uStack_2010 = uStack_2e70;
          uStack_2008 = uStack_2e68;
          local_1dc0 = local_2e00;
          uStack_1db8 = uStack_2df8;
          uStack_1db0 = uStack_2df0;
          uStack_1da8 = uStack_2de8;
          local_1d80 = local_2d80;
          uStack_1d78 = uStack_2d78;
          uStack_1d70 = uStack_2d70;
          uStack_1d68 = uStack_2d68;
          local_1d40 = local_2d00;
          uStack_1d38 = uStack_2cf8;
          uStack_1d30 = uStack_2cf0;
          uStack_1d28 = uStack_2ce8;
          local_1d20 = local_b40._0_8_;
          uStack_1d18 = local_b40._8_8_;
          uStack_1d10 = local_b40._16_8_;
          uStack_1d08 = local_b40._24_8_;
          local_1d00 = local_2c80;
          uStack_1cf8 = uStack_2c78;
          uStack_1cf0 = uStack_2c70;
          uStack_1ce8 = uStack_2c68;
          local_1900 = local_a80._0_8_;
          uStack_18f8 = local_a80._8_8_;
          uStack_18f0 = local_a80._16_8_;
          uStack_18e8 = local_a80._24_8_;
          local_1780 = local_ac0._0_8_;
          uStack_1778 = local_ac0._8_8_;
          uStack_1770 = local_ac0._16_8_;
          uStack_1768 = local_ac0._24_8_;
          local_1600 = local_b00._0_8_;
          uStack_15f8 = local_b00._8_8_;
          uStack_15f0 = local_b00._16_8_;
          uStack_15e8 = local_b00._24_8_;
          local_b40 = auVar73;
          local_b20 = local_1e54;
          local_b1c = local_1e54;
          local_b18 = local_1e54;
          local_b14 = local_1e54;
          local_b10 = local_1e54;
          local_b0c = local_1e54;
          local_b08 = local_1e54;
          local_b04 = local_1e54;
          local_b00 = auVar74;
          local_ae0 = local_1e58;
          local_adc = local_1e58;
          local_ad8 = local_1e58;
          local_ad4 = local_1e58;
          local_ad0 = local_1e58;
          local_acc = local_1e58;
          local_ac8 = local_1e58;
          local_ac4 = local_1e58;
          local_ac0 = auVar75;
          local_aa0 = local_1e5c;
          local_a9c = local_1e5c;
          local_a98 = local_1e5c;
          local_a94 = local_1e5c;
          local_a90 = local_1e5c;
          local_a8c = local_1e5c;
          local_a88 = local_1e5c;
          local_a84 = local_1e5c;
          local_a80 = auVar76;
          local_a60 = local_1e60;
          local_a5c = local_1e60;
          local_a58 = local_1e60;
          local_a54 = local_1e60;
          local_a50 = local_1e60;
          local_a4c = local_1e60;
          local_a48 = local_1e60;
          local_a44 = local_1e60;
          fStack_484 = fStack_15c4;
          fStack_444 = fStack_1624;
          fStack_404 = fStack_1684;
          fStack_3c4 = fStack_16e4;
          fStack_384 = fStack_1744;
          fStack_344 = fStack_17a4;
          fStack_304 = fStack_1804;
          fStack_2c4 = fStack_1864;
          fStack_284 = fStack_18c4;
          fStack_244 = fStack_1924;
          fStack_204 = fStack_1984;
          fStack_1c4 = fStack_19e4;
        }
      }
    }
    local_1e64 = *local_2398;
    auVar1 = vinsertps_avx(ZEXT416(local_1e64),ZEXT416(local_1e64),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e64),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1e64),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_1e64),ZEXT416(local_1e64),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e64),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1e64),0x30);
    auVar77._16_16_ = auVar1;
    auVar77._0_16_ = auVar2;
    local_a40._0_8_ = auVar2._0_8_;
    local_a40._8_8_ = auVar2._8_8_;
    local_a40._16_8_ = auVar1._0_8_;
    local_a40._24_8_ = auVar1._8_8_;
    local_2f00 = local_a40._0_8_;
    uStack_2ef8 = local_a40._8_8_;
    uStack_2ef0 = local_a40._16_8_;
    uStack_2ee8 = local_a40._24_8_;
    local_1e68 = local_2398[1];
    auVar3 = vinsertps_avx(ZEXT416(local_1e68),ZEXT416(local_1e68),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e68),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1e68),0x30);
    auVar4 = vinsertps_avx(ZEXT416(local_1e68),ZEXT416(local_1e68),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e68),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(local_1e68),0x30);
    auVar78._16_16_ = auVar3;
    auVar78._0_16_ = auVar4;
    local_a00._0_8_ = auVar4._0_8_;
    local_a00._8_8_ = auVar4._8_8_;
    local_a00._16_8_ = auVar3._0_8_;
    local_a00._24_8_ = auVar3._8_8_;
    local_2f20 = local_a00._0_8_;
    uStack_2f18 = local_a00._8_8_;
    uStack_2f10 = local_a00._16_8_;
    uStack_2f08 = local_a00._24_8_;
    local_1e6c = local_2398[2];
    auVar5 = vinsertps_avx(ZEXT416(local_1e6c),ZEXT416(local_1e6c),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e6c),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(local_1e6c),0x30);
    auVar6 = vinsertps_avx(ZEXT416(local_1e6c),ZEXT416(local_1e6c),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e6c),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1e6c),0x30);
    auVar79._16_16_ = auVar5;
    auVar79._0_16_ = auVar6;
    local_9c0._0_8_ = auVar6._0_8_;
    local_9c0._8_8_ = auVar6._8_8_;
    local_9c0._16_8_ = auVar5._0_8_;
    local_9c0._24_8_ = auVar5._8_8_;
    local_2f40 = local_9c0._0_8_;
    uStack_2f38 = local_9c0._8_8_;
    uStack_2f30 = local_9c0._16_8_;
    uStack_2f28 = local_9c0._24_8_;
    local_1e70 = local_2398[3];
    auVar7 = vinsertps_avx(ZEXT416(local_1e70),ZEXT416(local_1e70),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e70),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1e70),0x30);
    auVar8 = vinsertps_avx(ZEXT416(local_1e70),ZEXT416(local_1e70),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e70),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(local_1e70),0x30);
    auVar80._16_16_ = auVar7;
    auVar80._0_16_ = auVar8;
    local_980._0_8_ = auVar8._0_8_;
    local_980._8_8_ = auVar8._8_8_;
    local_980._16_8_ = auVar7._0_8_;
    local_980._24_8_ = auVar7._8_8_;
    local_2f60 = local_980._0_8_;
    uStack_2f58 = local_980._8_8_;
    uStack_2f50 = local_980._16_8_;
    uStack_2f48 = local_980._24_8_;
    local_2f68 = local_24e0;
    local_2f70 = local_24e8;
    local_2f78 = local_24f0;
    local_2f80 = local_24f8;
    local_2128 = local_2380;
    local_212c = local_2500;
    local_2f88 = (undefined8 *)
                 (*local_2380 +
                 (long)*(int *)((long)local_2380 + 0x2c) * (long)local_2500 * local_2380[2]);
    for (local_2f8c = 0; local_2f8c < local_23a4; local_2f8c = local_2f8c + 1) {
      local_2358 = local_2f68;
      local_2fc0 = *local_2f68;
      uStack_2fb8 = local_2f68[1];
      uStack_2fb0 = local_2f68[2];
      uStack_2fa8 = local_2f68[3];
      local_2360 = local_2f70;
      uVar9 = *local_2f70;
      uVar10 = local_2f70[1];
      uVar11 = local_2f70[2];
      uVar12 = local_2f70[3];
      local_2368 = local_2f78;
      uVar13 = *local_2f78;
      uVar14 = local_2f78[1];
      uVar15 = local_2f78[2];
      uVar16 = local_2f78[3];
      local_2370 = local_2f80;
      uVar17 = *local_2f80;
      uVar18 = local_2f80[1];
      uVar19 = local_2f80[2];
      uVar20 = local_2f80[3];
      local_1e00._0_4_ = (float)local_2fc0;
      local_1e00._4_4_ = (float)((ulong)local_2fc0 >> 0x20);
      uStack_1df8._0_4_ = (float)uStack_2fb8;
      uStack_1df8._4_4_ = (float)((ulong)uStack_2fb8 >> 0x20);
      uStack_1df0._0_4_ = (float)uStack_2fb0;
      uStack_1df0._4_4_ = (float)((ulong)uStack_2fb0 >> 0x20);
      uStack_1de8._0_4_ = (float)uStack_2fa8;
      uStack_1de8._4_4_ = (float)((ulong)uStack_2fa8 >> 0x20);
      local_1e20._0_4_ = auVar2._0_4_;
      local_1e20._4_4_ = auVar2._4_4_;
      uStack_1e18._0_4_ = auVar2._8_4_;
      uStack_1e18._4_4_ = auVar2._12_4_;
      uStack_1e10._0_4_ = auVar1._0_4_;
      uStack_1e10._4_4_ = auVar1._4_4_;
      uStack_1e08._0_4_ = auVar1._8_4_;
      local_3040 = CONCAT44(local_1e00._4_4_ * local_1e20._4_4_,
                            (float)local_1e00 * (float)local_1e20);
      uStack_3038 = CONCAT44(uStack_1df8._4_4_ * uStack_1e18._4_4_,
                             (float)uStack_1df8 * (float)uStack_1e18);
      uStack_3030 = CONCAT44(uStack_1df0._4_4_ * uStack_1e10._4_4_,
                             (float)uStack_1df0 * (float)uStack_1e10);
      uStack_3028 = CONCAT44(uStack_1de8._4_4_,(float)uStack_1de8 * (float)uStack_1e08);
      local_1a88 = &local_2fe0;
      local_1a90 = &local_2f20;
      local_1a98 = &local_3040;
      local_2fe0._0_4_ = (float)uVar9;
      local_1a60 = (float)local_2fe0;
      local_2fe0._4_4_ = (float)((ulong)uVar9 >> 0x20);
      fStack_1a5c = local_2fe0._4_4_;
      uStack_2fd8._0_4_ = (float)uVar10;
      fStack_1a58 = (float)uStack_2fd8;
      uStack_2fd8._4_4_ = (float)((ulong)uVar10 >> 0x20);
      fStack_1a54 = uStack_2fd8._4_4_;
      uStack_2fd0._0_4_ = (float)uVar11;
      fStack_1a50 = (float)uStack_2fd0;
      uStack_2fd0._4_4_ = (float)((ulong)uVar11 >> 0x20);
      fStack_1a4c = uStack_2fd0._4_4_;
      uStack_2fc8._0_4_ = (float)uVar12;
      fStack_1a48 = (float)uStack_2fc8;
      uStack_2fc8._4_4_ = (float)((ulong)uVar12 >> 0x20);
      fStack_1a44 = uStack_2fc8._4_4_;
      local_1a80._0_4_ = auVar4._0_4_;
      local_1a80._4_4_ = auVar4._4_4_;
      uStack_1a78._0_4_ = auVar4._8_4_;
      uStack_1a78._4_4_ = auVar4._12_4_;
      uStack_1a70._0_4_ = auVar3._0_4_;
      uStack_1a70._4_4_ = auVar3._4_4_;
      uStack_1a68._0_4_ = auVar3._8_4_;
      local_1a0 = (float)local_2fe0 * (float)local_1a80;
      fStack_19c = local_2fe0._4_4_ * local_1a80._4_4_;
      fStack_198 = (float)uStack_2fd8 * (float)uStack_1a78;
      fStack_194 = uStack_2fd8._4_4_ * uStack_1a78._4_4_;
      fStack_190 = (float)uStack_2fd0 * (float)uStack_1a70;
      fStack_18c = uStack_2fd0._4_4_ * uStack_1a70._4_4_;
      fStack_188 = (float)uStack_2fc8 * (float)uStack_1a68;
      local_1c0 = local_3040;
      uStack_1b8 = uStack_3038;
      uStack_1b0 = uStack_3030;
      uStack_1a8 = uStack_3028;
      fVar60 = local_1a0 + (float)local_1e00 * (float)local_1e20;
      fVar81 = fStack_19c + local_1e00._4_4_ * local_1e20._4_4_;
      fVar82 = fStack_198 + (float)uStack_1df8 * (float)uStack_1e18;
      fVar84 = fStack_194 + uStack_1df8._4_4_ * uStack_1e18._4_4_;
      fVar88 = fStack_190 + (float)uStack_1df0 * (float)uStack_1e10;
      fVar97 = fStack_18c + uStack_1df0._4_4_ * uStack_1e10._4_4_;
      fVar107 = fStack_188 + (float)uStack_1de8 * (float)uStack_1e08;
      local_180 = CONCAT44(fVar81,fVar60);
      uStack_178 = CONCAT44(fVar84,fVar82);
      uStack_170 = CONCAT44(fVar97,fVar88);
      uStack_168 = CONCAT44(uStack_2fc8._4_4_ + uStack_1de8._4_4_,fVar107);
      local_1ae8 = &local_3000;
      local_1af0 = &local_2f40;
      local_1af8 = &local_3040;
      local_3000._0_4_ = (float)uVar13;
      local_1ac0 = (float)local_3000;
      local_3000._4_4_ = (float)((ulong)uVar13 >> 0x20);
      fStack_1abc = local_3000._4_4_;
      uStack_2ff8._0_4_ = (float)uVar14;
      fStack_1ab8 = (float)uStack_2ff8;
      uStack_2ff8._4_4_ = (float)((ulong)uVar14 >> 0x20);
      fStack_1ab4 = uStack_2ff8._4_4_;
      uStack_2ff0._0_4_ = (float)uVar15;
      fStack_1ab0 = (float)uStack_2ff0;
      uStack_2ff0._4_4_ = (float)((ulong)uVar15 >> 0x20);
      fStack_1aac = uStack_2ff0._4_4_;
      uStack_2fe8._0_4_ = (float)uVar16;
      fStack_1aa8 = (float)uStack_2fe8;
      uStack_2fe8._4_4_ = (float)((ulong)uVar16 >> 0x20);
      fStack_1aa4 = uStack_2fe8._4_4_;
      local_1ae0._0_4_ = auVar6._0_4_;
      local_1ae0._4_4_ = auVar6._4_4_;
      uStack_1ad8._0_4_ = auVar6._8_4_;
      uStack_1ad8._4_4_ = auVar6._12_4_;
      uStack_1ad0._0_4_ = auVar5._0_4_;
      uStack_1ad0._4_4_ = auVar5._4_4_;
      uStack_1ac8._0_4_ = auVar5._8_4_;
      local_160 = (float)local_3000 * (float)local_1ae0;
      fStack_15c = local_3000._4_4_ * local_1ae0._4_4_;
      fStack_158 = (float)uStack_2ff8 * (float)uStack_1ad8;
      fStack_154 = uStack_2ff8._4_4_ * uStack_1ad8._4_4_;
      fStack_150 = (float)uStack_2ff0 * (float)uStack_1ad0;
      fStack_14c = uStack_2ff0._4_4_ * uStack_1ad0._4_4_;
      fStack_148 = (float)uStack_2fe8 * (float)uStack_1ac8;
      fVar60 = local_160 + fVar60;
      fVar81 = fStack_15c + fVar81;
      fVar82 = fStack_158 + fVar82;
      fVar84 = fStack_154 + fVar84;
      fVar88 = fStack_150 + fVar88;
      fVar97 = fStack_14c + fVar97;
      fVar107 = fStack_148 + fVar107;
      uStack_2fe8._4_4_ = uStack_2fe8._4_4_ + uStack_2fc8._4_4_ + uStack_1de8._4_4_;
      local_140 = CONCAT44(fVar81,fVar60);
      uStack_138 = CONCAT44(fVar84,fVar82);
      uStack_130 = CONCAT44(fVar97,fVar88);
      uStack_128 = CONCAT44(uStack_2fe8._4_4_,fVar107);
      local_1b48 = &local_3020;
      local_1b50 = &local_2f60;
      local_1b58 = &local_3040;
      local_3020._0_4_ = (float)uVar17;
      local_1b20 = (float)local_3020;
      local_3020._4_4_ = (float)((ulong)uVar17 >> 0x20);
      fStack_1b1c = local_3020._4_4_;
      uStack_3018._0_4_ = (float)uVar18;
      fStack_1b18 = (float)uStack_3018;
      uStack_3018._4_4_ = (float)((ulong)uVar18 >> 0x20);
      fStack_1b14 = uStack_3018._4_4_;
      uStack_3010._0_4_ = (float)uVar19;
      fStack_1b10 = (float)uStack_3010;
      uStack_3010._4_4_ = (float)((ulong)uVar19 >> 0x20);
      fStack_1b0c = uStack_3010._4_4_;
      uStack_3008._0_4_ = (float)uVar20;
      fStack_1b08 = (float)uStack_3008;
      uStack_3008._4_4_ = (float)((ulong)uVar20 >> 0x20);
      fStack_1b04 = uStack_3008._4_4_;
      local_1b40._0_4_ = auVar8._0_4_;
      local_1b40._4_4_ = auVar8._4_4_;
      uStack_1b38._0_4_ = auVar8._8_4_;
      uStack_1b38._4_4_ = auVar8._12_4_;
      uStack_1b30._0_4_ = auVar7._0_4_;
      uStack_1b30._4_4_ = auVar7._4_4_;
      uStack_1b28._0_4_ = auVar7._8_4_;
      local_120 = (float)local_3020 * (float)local_1b40;
      fStack_11c = local_3020._4_4_ * local_1b40._4_4_;
      fStack_118 = (float)uStack_3018 * (float)uStack_1b38;
      fStack_114 = uStack_3018._4_4_ * uStack_1b38._4_4_;
      fStack_110 = (float)uStack_3010 * (float)uStack_1b30;
      fStack_10c = uStack_3010._4_4_ * uStack_1b30._4_4_;
      fStack_108 = (float)uStack_3008 * (float)uStack_1b28;
      local_3040 = CONCAT44(fStack_11c + fVar81,local_120 + fVar60);
      uStack_3038 = CONCAT44(fStack_114 + fVar84,fStack_118 + fVar82);
      uStack_3030 = CONCAT44(fStack_10c + fVar97,fStack_110 + fVar88);
      uStack_3028 = CONCAT44(uStack_3008._4_4_ + uStack_2fe8._4_4_,fStack_108 + fVar107);
      local_20e8 = local_2f88;
      *local_2f88 = local_3040;
      local_2f88[1] = uStack_3038;
      local_2f88[2] = uStack_3030;
      local_2f88[3] = uStack_3028;
      local_2f88 = local_2f88 + 4;
      local_2f68 = local_2f68 + 4;
      local_2f70 = local_2f70 + 4;
      local_2f78 = local_2f78 + 4;
      local_2f80 = local_2f80 + 4;
      local_3020 = uVar17;
      uStack_3018 = uVar18;
      uStack_3010 = uVar19;
      uStack_3008 = uVar20;
      local_3000 = uVar13;
      uStack_2ff8 = uVar14;
      uStack_2ff0 = uVar15;
      uStack_2fe8 = uVar16;
      local_2fe0 = uVar9;
      uStack_2fd8 = uVar10;
      uStack_2fd0 = uVar11;
      uStack_2fc8 = uVar12;
      local_2120 = local_3040;
      uStack_2118 = uStack_3038;
      uStack_2110 = uStack_3030;
      uStack_2108 = uStack_3028;
      local_1e20 = local_a40._0_8_;
      uStack_1e18 = local_a40._8_8_;
      uStack_1e10 = local_a40._16_8_;
      uStack_1e08 = local_a40._24_8_;
      local_1e00 = local_2fc0;
      uStack_1df8 = uStack_2fb8;
      uStack_1df0 = uStack_2fb0;
      uStack_1de8 = uStack_2fa8;
      local_1b40 = local_980._0_8_;
      uStack_1b38 = local_980._8_8_;
      uStack_1b30 = local_980._16_8_;
      uStack_1b28 = local_980._24_8_;
      local_1ae0 = local_9c0._0_8_;
      uStack_1ad8 = local_9c0._8_8_;
      uStack_1ad0 = local_9c0._16_8_;
      uStack_1ac8 = local_9c0._24_8_;
      local_1a80 = local_a00._0_8_;
      uStack_1a78 = local_a00._8_8_;
      uStack_1a70 = local_a00._16_8_;
      uStack_1a68 = local_a00._24_8_;
      fStack_184 = fStack_1a44;
      fStack_144 = fStack_1aa4;
      fStack_104 = fStack_1b04;
    }
    local_2398 = local_2398 + 4;
    local_24fc = local_2504;
    local_a40 = auVar77;
    local_a20 = local_1e64;
    local_a1c = local_1e64;
    local_a18 = local_1e64;
    local_a14 = local_1e64;
    local_a10 = local_1e64;
    local_a0c = local_1e64;
    local_a08 = local_1e64;
    local_a04 = local_1e64;
    local_a00 = auVar78;
    local_9e0 = local_1e68;
    local_9dc = local_1e68;
    local_9d8 = local_1e68;
    local_9d4 = local_1e68;
    local_9d0 = local_1e68;
    local_9cc = local_1e68;
    local_9c8 = local_1e68;
    local_9c4 = local_1e68;
    local_9c0 = auVar79;
    local_9a0 = local_1e6c;
    local_99c = local_1e6c;
    local_998 = local_1e6c;
    local_994 = local_1e6c;
    local_990 = local_1e6c;
    local_98c = local_1e6c;
    local_988 = local_1e6c;
    local_984 = local_1e6c;
    local_980 = auVar80;
    local_960 = local_1e70;
    local_95c = local_1e70;
    local_958 = local_1e70;
    local_954 = local_1e70;
    local_950 = local_1e70;
    local_94c = local_1e70;
    local_948 = local_1e70;
    local_944 = local_1e70;
  }
  ppuVar108 = &local_24d8;
  local_2210 = ppuVar108;
  local_e88 = ppuVar108;
  if (local_24d0 != (int *)0x0) {
    local_e8c = 0xffffffff;
    LOCK();
    local_e90 = *local_24d0;
    *local_24d0 = *local_24d0 + -1;
    UNLOCK();
    if (local_e90 == 1) {
      if (local_24b8 == (long *)0x0) {
        local_e80 = local_24d8;
        if (local_24d8 != (undefined8 *)0x0) {
          free(local_24d8);
        }
      }
      else {
        (**(code **)(*local_24b8 + 0x18))(local_24b8,local_24d8);
      }
    }
  }
  *ppuVar108 = (undefined8 *)0x0;
  ppuVar108[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar108 + 3) = 0;
  *(undefined4 *)(ppuVar108 + 5) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x2c) = 0;
  *(undefined4 *)(ppuVar108 + 6) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x34) = 0;
  *(undefined4 *)(ppuVar108 + 7) = 0;
  ppuVar108[8] = (undefined8 *)0x0;
  ppuVar108[1] = (undefined8 *)0x0;
  ppuVar108 = &local_2490;
  local_2200 = ppuVar108;
  local_ea8 = ppuVar108;
  if (local_2488 != (int *)0x0) {
    local_eac = 0xffffffff;
    LOCK();
    local_eb0 = *local_2488;
    *local_2488 = *local_2488 + -1;
    UNLOCK();
    if (local_eb0 == 1) {
      if (local_2470 == (long *)0x0) {
        local_e70 = local_2490;
        if (local_2490 != (undefined8 *)0x0) {
          free(local_2490);
        }
      }
      else {
        (**(code **)(*local_2470 + 0x18))(local_2470,local_2490);
      }
    }
  }
  *ppuVar108 = (undefined8 *)0x0;
  ppuVar108[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar108 + 3) = 0;
  *(undefined4 *)(ppuVar108 + 5) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x2c) = 0;
  *(undefined4 *)(ppuVar108 + 6) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x34) = 0;
  *(undefined4 *)(ppuVar108 + 7) = 0;
  ppuVar108[8] = (undefined8 *)0x0;
  ppuVar108[1] = (undefined8 *)0x0;
  ppuVar108 = &local_2438;
  local_21f0 = ppuVar108;
  local_ec8 = ppuVar108;
  if (local_2430 != (int *)0x0) {
    local_ecc = 0xffffffff;
    LOCK();
    local_ed0 = *local_2430;
    *local_2430 = *local_2430 + -1;
    UNLOCK();
    if (local_ed0 == 1) {
      if (local_2418 == (long *)0x0) {
        local_e60 = local_2438;
        if (local_2438 != (undefined8 *)0x0) {
          free(local_2438);
        }
      }
      else {
        (**(code **)(*local_2418 + 0x18))(local_2418,local_2438);
      }
    }
  }
  *ppuVar108 = (undefined8 *)0x0;
  ppuVar108[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar108 + 3) = 0;
  *(undefined4 *)(ppuVar108 + 5) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x2c) = 0;
  *(undefined4 *)(ppuVar108 + 6) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x34) = 0;
  *(undefined4 *)(ppuVar108 + 7) = 0;
  ppuVar108[8] = (undefined8 *)0x0;
  ppuVar108[1] = (undefined8 *)0x0;
  ppuVar108 = &local_23f0;
  if (local_23e8 != (int *)0x0) {
    local_eec = 0xffffffff;
    LOCK();
    local_ef0 = *local_23e8;
    *local_23e8 = *local_23e8 + -1;
    UNLOCK();
    if (local_ef0 == 1) {
      local_21e0 = ppuVar108;
      local_ee8 = ppuVar108;
      if (local_23d0 == (long *)0x0) {
        local_e50 = local_23f0;
        if (local_23f0 != (undefined8 *)0x0) {
          free(local_23f0);
        }
      }
      else {
        (**(code **)(*local_23d0 + 0x18))(local_23d0,local_23f0);
      }
    }
  }
  *ppuVar108 = (undefined8 *)0x0;
  ppuVar108[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar108 + 3) = 0;
  *(undefined4 *)(ppuVar108 + 5) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x2c) = 0;
  *(undefined4 *)(ppuVar108 + 6) = 0;
  *(undefined4 *)((long)ppuVar108 + 0x34) = 0;
  *(undefined4 *)(ppuVar108 + 7) = 0;
  ppuVar108[8] = (undefined8 *)0x0;
  ppuVar108[1] = (undefined8 *)0x0;
  return;
}

Assistant:

static void resize_bicubic_image_pack8(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)8 * 4u, 8);
    Mat rowsbuf1(w, (size_t)8 * 4u, 8);
    Mat rowsbuf2(w, (size_t)8 * 4u, 8);
    Mat rowsbuf3(w, (size_t)8 * 4u, 8);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S20 = _mm256_load_ps(S2p - 8);
                __m256 _S21 = _mm256_load_ps(S2p + 0);
                __m256 _S22 = _mm256_load_ps(S2p + 8);
                __m256 _S23 = _mm256_load_ps(S2p + 16);
                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows2 = _mm256_mul_ps(_S20, _a0);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows2 = _mm256_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows2 = _mm256_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows2 = _mm256_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows2p + dx * 8, _rows2);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S10 = _mm256_load_ps(S1p - 8);
                __m256 _S11 = _mm256_load_ps(S1p + 0);
                __m256 _S12 = _mm256_load_ps(S1p + 8);
                __m256 _S13 = _mm256_load_ps(S1p + 16);
                __m256 _S20 = _mm256_load_ps(S2p - 8);
                __m256 _S21 = _mm256_load_ps(S2p + 0);
                __m256 _S22 = _mm256_load_ps(S2p + 8);
                __m256 _S23 = _mm256_load_ps(S2p + 16);
                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                __m256 _rows2 = _mm256_mul_ps(_S20, _a0);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows1 = _mm256_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows1 = _mm256_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows1p + dx * 8, _rows1);
                _mm256_store_ps(rows2p + dx * 8, _rows2);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);
                __m256 _a2 = _mm256_set1_ps(alphap[2]);
                __m256 _a3 = _mm256_set1_ps(alphap[3]);

                __m256 _S00 = _mm256_load_ps(S0p - 8);
                __m256 _S01 = _mm256_load_ps(S0p + 0);
                __m256 _S02 = _mm256_load_ps(S0p + 8);
                __m256 _S03 = _mm256_load_ps(S0p + 16);
                __m256 _S10 = _mm256_load_ps(S1p - 8);
                __m256 _S11 = _mm256_load_ps(S1p + 0);
                __m256 _S12 = _mm256_load_ps(S1p + 8);
                __m256 _S13 = _mm256_load_ps(S1p + 16);
                __m256 _S20 = _mm256_load_ps(S2p - 8);
                __m256 _S21 = _mm256_load_ps(S2p + 0);
                __m256 _S22 = _mm256_load_ps(S2p + 8);
                __m256 _S23 = _mm256_load_ps(S2p + 16);
                __m256 _S30 = _mm256_load_ps(S3p - 8);
                __m256 _S31 = _mm256_load_ps(S3p + 0);
                __m256 _S32 = _mm256_load_ps(S3p + 8);
                __m256 _S33 = _mm256_load_ps(S3p + 16);
                __m256 _rows0 = _mm256_mul_ps(_S00, _a0);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                __m256 _rows2 = _mm256_mul_ps(_S20, _a0);
                __m256 _rows3 = _mm256_mul_ps(_S30, _a0);
                _rows0 = _mm256_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows0 = _mm256_comp_fmadd_ps(_S02, _a2, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows0 = _mm256_comp_fmadd_ps(_S03, _a3, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm256_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm256_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm256_store_ps(rows0p + dx * 8, _rows0);
                _mm256_store_ps(rows1p + dx * 8, _rows1);
                _mm256_store_ps(rows2p + dx * 8, _rows2);
                _mm256_store_ps(rows3p + dx * 8, _rows3);

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m256 _b0 = _mm256_set1_ps(beta[0]);
        __m256 _b1 = _mm256_set1_ps(beta[1]);
        __m256 _b2 = _mm256_set1_ps(beta[2]);
        __m256 _b3 = _mm256_set1_ps(beta[3]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m256 _rows0 = _mm256_load_ps(rows0p);
            __m256 _rows1 = _mm256_load_ps(rows1p);
            __m256 _rows2 = _mm256_load_ps(rows2p);
            __m256 _rows3 = _mm256_load_ps(rows3p);
            __m256 _D = _mm256_mul_ps(_rows0, _b0);
            _D = _mm256_comp_fmadd_ps(_rows1, _b1, _D);
            _D = _mm256_comp_fmadd_ps(_rows2, _b2, _D);
            _D = _mm256_comp_fmadd_ps(_rows3, _b3, _D);
            _mm256_store_ps(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
            rows2p += 8;
            rows3p += 8;
        }

        beta += 4;
    }
}